

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::SubGridIntersector1Pluecker<4,_true>_>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined8 uVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  ushort uVar9;
  ushort uVar10;
  ulong uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  RTCIntersectArguments *pRVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined1 auVar26 [16];
  undefined1 (*pauVar27) [16];
  uint uVar28;
  undefined4 uVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  Scene *pSVar33;
  undefined8 uVar34;
  RayHit *pRVar35;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  uint uVar40;
  int iVar41;
  undefined1 (*pauVar42) [16];
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  long lVar46;
  RTCRayQueryContext *pRVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  byte bVar51;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  byte bVar82;
  byte bVar83;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  float fVar131;
  float fVar132;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar133;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar134;
  float fVar139;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar151;
  uint uVar152;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar153;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar159;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar160;
  float fVar168;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar169;
  float fVar173;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar174;
  float fVar177;
  float fVar178;
  undefined1 auVar175 [16];
  float fVar179;
  undefined1 auVar176 [16];
  float fVar180;
  float fVar181;
  float fVar185;
  float fVar187;
  undefined1 auVar182 [16];
  float fVar186;
  float fVar188;
  float fVar189;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar190;
  float fVar193;
  float fVar194;
  undefined1 auVar191 [16];
  float fVar195;
  undefined1 auVar192 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar198;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar204;
  float fVar206;
  undefined1 auVar205 [16];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_14a5;
  undefined1 local_14a4 [12];
  undefined1 local_1498 [4];
  undefined1 auStack_1494 [8];
  float fStack_148c;
  undefined1 local_1488 [8];
  float fStack_1480;
  float fStack_147c;
  float local_1478;
  anon_union_12_2_4062524c_for_Vec3<float>_1 aStack_1474;
  ulong local_1460;
  uint local_1458 [1];
  uint auStack_1454 [1];
  float fStack_1450;
  float fStack_144c;
  float local_1448;
  float fStack_1444;
  float fStack_1440;
  float fStack_143c;
  undefined8 local_1438;
  float fStack_1430;
  float fStack_142c;
  undefined1 local_1428 [8];
  uint uStack_1420;
  uint uStack_141c;
  RTCFilterFunctionNArguments local_1418;
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  float local_13c8;
  float fStack_13c4;
  float fStack_13c0;
  float fStack_13bc;
  undefined8 local_13b8;
  float fStack_13b0;
  float fStack_13ac;
  float local_13a8;
  float local_13a4;
  undefined4 local_13a0;
  undefined4 local_139c;
  undefined4 local_1398;
  undefined4 local_1394;
  undefined4 local_1390;
  uint local_138c;
  uint local_1388;
  undefined1 local_1378 [8];
  float fStack_1370;
  float fStack_136c;
  RayQueryContext *local_1368;
  ulong local_1360;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  undefined1 local_1328 [8];
  float fStack_1320;
  float fStack_131c;
  undefined1 local_1318 [8];
  float fStack_1310;
  float fStack_130c;
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  undefined1 local_12e8 [8];
  float fStack_12e0;
  float fStack_12dc;
  undefined1 local_12d8 [8];
  float fStack_12d0;
  float fStack_12cc;
  undefined1 local_12c8 [16];
  undefined1 *local_12b8;
  undefined1 local_12a8 [16];
  undefined1 local_1298 [16];
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  ulong local_1218;
  ulong local_1210;
  ulong local_1208;
  ulong local_1200;
  ulong local_11f8;
  ulong local_11f0;
  long local_11e8;
  long local_11e0;
  ulong local_11d8;
  ulong local_11d0;
  undefined1 (*local_11c8) [16];
  long local_11c0;
  ulong local_11b8;
  ulong local_11b0;
  ulong local_11a8;
  ulong local_11a0;
  undefined1 local_1198 [16];
  uint local_1188;
  uint uStack_1184;
  uint uStack_1180;
  uint uStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined8 local_1098;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined8 local_1068;
  float fStack_1060;
  float fStack_105c;
  undefined8 local_1058;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar42 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    uVar29 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    uVar24 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    uVar25 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    fVar180 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar8 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar204 = 0.0;
    if (0.0 <= fVar180) {
      fVar204 = fVar180;
    }
    fVar180 = (ray->super_RayK<1>).tfar;
    fVar159 = 0.0;
    if (0.0 <= fVar180) {
      fVar159 = fVar180;
    }
    auVar52._4_4_ = -(uint)(ABS(aVar8.y) < 1e-18);
    auVar52._0_4_ = -(uint)(ABS(aVar8.x) < 1e-18);
    auVar52._8_4_ = -(uint)(ABS(aVar8.z) < 1e-18);
    auVar52._12_4_ = -(uint)(ABS(aVar8.field_3.w) < 1e-18);
    auVar182 = divps(_DAT_01f46a60,(undefined1  [16])aVar8);
    auVar182 = blendvps(auVar182,_DAT_01f76a70,auVar52);
    fVar169 = auVar182._0_4_ * 0.99999964;
    fVar173 = auVar182._4_4_ * 0.99999964;
    auVar170._8_4_ = auVar182._8_4_ * 0.99999964;
    fVar180 = auVar182._0_4_ * 1.0000004;
    fVar185 = auVar182._4_4_ * 1.0000004;
    fVar187 = auVar182._8_4_ * 1.0000004;
    auVar191._4_4_ = uVar29;
    auVar191._0_4_ = uVar29;
    auVar191._8_4_ = uVar29;
    auVar191._12_4_ = uVar29;
    auVar182._4_4_ = uVar24;
    auVar182._0_4_ = uVar24;
    auVar182._8_4_ = uVar24;
    auVar182._12_4_ = uVar24;
    auVar147._4_4_ = uVar25;
    auVar147._0_4_ = uVar25;
    auVar147._8_4_ = uVar25;
    auVar147._12_4_ = uVar25;
    auVar89._4_4_ = fVar173;
    auVar89._0_4_ = fVar173;
    auVar89._8_4_ = fVar173;
    auVar89._12_4_ = fVar173;
    auVar170._4_4_ = auVar170._8_4_;
    auVar170._0_4_ = auVar170._8_4_;
    auVar170._12_4_ = auVar170._8_4_;
    uVar43 = (ulong)(fVar169 < 0.0) << 4;
    uVar37 = (ulong)(fVar173 < 0.0) << 4 | 0x20;
    local_11a0 = (ulong)(auVar170._8_4_ < 0.0) << 4 | 0x40;
    auVar87._4_4_ = fVar204;
    auVar87._0_4_ = fVar204;
    auVar87._8_4_ = fVar204;
    auVar87._12_4_ = fVar204;
    auVar175._4_4_ = fVar159;
    auVar175._0_4_ = fVar159;
    auVar175._8_4_ = fVar159;
    auVar175._12_4_ = fVar159;
    local_11f0 = (ulong)(((uint)(fVar169 < 0.0) << 4) >> 2);
    local_11a8 = uVar43 ^ 0x10;
    local_11f8 = (uVar43 ^ 0x10) >> 2;
    local_1200 = uVar37 >> 2;
    local_11b0 = uVar37 ^ 0x10;
    local_1208 = (uVar37 ^ 0x10) >> 2;
    local_1210 = local_11a0 >> 2;
    local_11b8 = local_11a0 ^ 0x10;
    local_1218 = (local_11a0 ^ 0x10) >> 2;
    _local_1188 = mm_lookupmask_ps._240_8_;
    _uStack_1180 = mm_lookupmask_ps._248_8_;
    local_1368 = context;
    local_1228 = fVar180;
    fStack_1224 = fVar180;
    fStack_1220 = fVar180;
    fStack_121c = fVar180;
    local_1238 = fVar185;
    fStack_1234 = fVar185;
    fStack_1230 = fVar185;
    fStack_122c = fVar185;
    local_10b8 = auVar147;
    local_1198 = auVar87;
    local_10a8 = fVar187;
    fStack_10a4 = fVar187;
    fStack_10a0 = fVar187;
    fStack_109c = fVar187;
    local_10c8 = auVar170;
    local_10d8 = auVar191;
    local_10e8 = auVar182;
    local_11d0 = uVar43;
    local_10f8 = fVar169;
    fStack_10f4 = fVar169;
    fStack_10f0 = fVar169;
    fStack_10ec = fVar169;
    local_1108 = auVar89;
    local_11d8 = uVar37;
    fVar204 = fVar180;
    fVar159 = fVar180;
    fVar173 = fVar180;
    fVar116 = fVar185;
    fVar131 = fVar185;
    fVar132 = fVar185;
    fVar133 = fVar187;
    fVar134 = fVar187;
    fVar141 = fVar187;
    fVar142 = fVar169;
    fVar151 = fVar169;
    fVar139 = fVar169;
LAB_006b81f2:
    if (pauVar42 != (undefined1 (*) [16])&local_f78) {
      pauVar27 = pauVar42 + -1;
      pauVar42 = pauVar42 + -1;
      pfVar6 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar27 + 8) < *pfVar6 || *(float *)((long)*pauVar27 + 8) == *pfVar6) {
        uVar31 = *(ulong *)*pauVar42;
        while ((uVar31 & 8) == 0) {
          pfVar6 = (float *)(uVar31 + 0x20 + uVar43);
          auVar84._0_4_ = (*pfVar6 - auVar191._0_4_) * fVar169;
          auVar84._4_4_ = (pfVar6[1] - auVar191._4_4_) * fVar142;
          auVar84._8_4_ = (pfVar6[2] - auVar191._8_4_) * fVar151;
          auVar84._12_4_ = (pfVar6[3] - auVar191._12_4_) * fVar139;
          pfVar6 = (float *)(uVar31 + 0x20 + uVar37);
          auVar136._0_4_ = (*pfVar6 - auVar182._0_4_) * auVar89._0_4_;
          auVar136._4_4_ = (pfVar6[1] - auVar182._4_4_) * auVar89._4_4_;
          auVar136._8_4_ = (pfVar6[2] - auVar182._8_4_) * auVar89._8_4_;
          auVar136._12_4_ = (pfVar6[3] - auVar182._12_4_) * auVar89._12_4_;
          auVar52 = maxps(auVar84,auVar136);
          pfVar6 = (float *)(uVar31 + 0x20 + local_11a0);
          auVar144._0_4_ = (*pfVar6 - auVar147._0_4_) * auVar170._0_4_;
          auVar144._4_4_ = (pfVar6[1] - auVar147._4_4_) * auVar170._4_4_;
          auVar144._8_4_ = (pfVar6[2] - auVar147._8_4_) * auVar170._8_4_;
          auVar144._12_4_ = (pfVar6[3] - auVar147._12_4_) * auVar170._12_4_;
          pfVar6 = (float *)(uVar31 + 0x20 + local_11a8);
          auVar103._0_4_ = (*pfVar6 - auVar191._0_4_) * fVar180;
          auVar103._4_4_ = (pfVar6[1] - auVar191._4_4_) * fVar204;
          auVar103._8_4_ = (pfVar6[2] - auVar191._8_4_) * fVar159;
          auVar103._12_4_ = (pfVar6[3] - auVar191._12_4_) * fVar173;
          pfVar6 = (float *)(uVar31 + 0x20 + local_11b0);
          auVar117._0_4_ = (*pfVar6 - auVar182._0_4_) * fVar185;
          auVar117._4_4_ = (pfVar6[1] - auVar182._4_4_) * fVar116;
          auVar117._8_4_ = (pfVar6[2] - auVar182._8_4_) * fVar131;
          auVar117._12_4_ = (pfVar6[3] - auVar182._12_4_) * fVar132;
          auVar104 = minps(auVar103,auVar117);
          pfVar6 = (float *)(uVar31 + 0x20 + local_11b8);
          auVar118._0_4_ = (*pfVar6 - auVar147._0_4_) * fVar187;
          auVar118._4_4_ = (pfVar6[1] - auVar147._4_4_) * fVar133;
          auVar118._8_4_ = (pfVar6[2] - auVar147._8_4_) * fVar134;
          auVar118._12_4_ = (pfVar6[3] - auVar147._12_4_) * fVar141;
          auVar84 = maxps(auVar144,auVar87);
          _local_12e8 = maxps(auVar52,auVar84);
          auVar52 = minps(auVar118,auVar175);
          auVar52 = minps(auVar104,auVar52);
          auVar104._4_4_ = -(uint)(local_12e8._4_4_ <= auVar52._4_4_);
          auVar104._0_4_ = -(uint)(local_12e8._0_4_ <= auVar52._0_4_);
          auVar104._8_4_ = -(uint)(local_12e8._8_4_ <= auVar52._8_4_);
          auVar104._12_4_ = -(uint)(local_12e8._12_4_ <= auVar52._12_4_);
          uVar28 = movmskps((int)local_11b8,auVar104);
          if (uVar28 == 0) goto LAB_006b81f2;
          uVar28 = uVar28 & 0xff;
          uVar44 = uVar31 & 0xfffffffffffffff0;
          lVar32 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
            }
          }
          uVar31 = *(ulong *)(uVar44 + lVar32 * 8);
          uVar28 = uVar28 - 1 & uVar28;
          if (uVar28 != 0) {
            uVar152 = *(uint *)(local_12e8 + lVar32 * 4);
            lVar32 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
            uVar11 = *(ulong *)(uVar44 + lVar32 * 8);
            uVar30 = *(uint *)(local_12e8 + lVar32 * 4);
            uVar28 = uVar28 - 1 & uVar28;
            if (uVar28 == 0) {
              if (uVar152 < uVar30) {
                *(ulong *)*pauVar42 = uVar11;
                *(uint *)((long)*pauVar42 + 8) = uVar30;
                pauVar42 = pauVar42 + 1;
              }
              else {
                *(ulong *)*pauVar42 = uVar31;
                *(uint *)((long)*pauVar42 + 8) = uVar152;
                pauVar42 = pauVar42 + 1;
                uVar31 = uVar11;
              }
            }
            else {
              auVar85._8_4_ = uVar152;
              auVar85._0_8_ = uVar31;
              auVar85._12_4_ = 0;
              auVar119._8_4_ = uVar30;
              auVar119._0_8_ = uVar11;
              auVar119._12_4_ = 0;
              lVar32 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                }
              }
              uVar34 = *(undefined8 *)(uVar44 + lVar32 * 8);
              iVar41 = *(int *)(local_12e8 + lVar32 * 4);
              auVar105._8_4_ = iVar41;
              auVar105._0_8_ = uVar34;
              auVar105._12_4_ = 0;
              auVar53._8_4_ = -(uint)((int)uVar152 < (int)uVar30);
              uVar28 = uVar28 - 1 & uVar28;
              if (uVar28 == 0) {
                auVar53._4_4_ = auVar53._8_4_;
                auVar53._0_4_ = auVar53._8_4_;
                auVar53._12_4_ = auVar53._8_4_;
                auVar135._8_4_ = uVar30;
                auVar135._0_8_ = uVar11;
                auVar135._12_4_ = 0;
                auVar84 = blendvps(auVar135,auVar85,auVar53);
                auVar52 = blendvps(auVar85,auVar119,auVar53);
                auVar54._8_4_ = -(uint)(auVar84._8_4_ < iVar41);
                auVar54._4_4_ = auVar54._8_4_;
                auVar54._0_4_ = auVar54._8_4_;
                auVar54._12_4_ = auVar54._8_4_;
                auVar120._8_4_ = iVar41;
                auVar120._0_8_ = uVar34;
                auVar120._12_4_ = 0;
                auVar104 = blendvps(auVar120,auVar84,auVar54);
                auVar136 = blendvps(auVar84,auVar105,auVar54);
                auVar55._8_4_ = -(uint)(auVar52._8_4_ < auVar136._8_4_);
                auVar55._4_4_ = auVar55._8_4_;
                auVar55._0_4_ = auVar55._8_4_;
                auVar55._12_4_ = auVar55._8_4_;
                auVar84 = blendvps(auVar136,auVar52,auVar55);
                auVar52 = blendvps(auVar52,auVar136,auVar55);
                *pauVar42 = auVar52;
                pauVar42[1] = auVar84;
                uVar31 = auVar104._0_8_;
                pauVar42 = pauVar42 + 2;
              }
              else {
                lVar32 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                  }
                }
                auVar56._4_4_ = auVar53._8_4_;
                auVar56._0_4_ = auVar53._8_4_;
                auVar56._8_4_ = auVar53._8_4_;
                auVar56._12_4_ = auVar53._8_4_;
                auVar136 = blendvps(auVar119,auVar85,auVar56);
                auVar52 = blendvps(auVar85,auVar119,auVar56);
                auVar143._8_4_ = *(int *)(local_12e8 + lVar32 * 4);
                auVar143._0_8_ = *(undefined8 *)(uVar44 + lVar32 * 8);
                auVar143._12_4_ = 0;
                auVar57._8_4_ = -(uint)(iVar41 < *(int *)(local_12e8 + lVar32 * 4));
                auVar57._4_4_ = auVar57._8_4_;
                auVar57._0_4_ = auVar57._8_4_;
                auVar57._12_4_ = auVar57._8_4_;
                auVar104 = blendvps(auVar143,auVar105,auVar57);
                auVar84 = blendvps(auVar105,auVar143,auVar57);
                auVar58._8_4_ = -(uint)(auVar52._8_4_ < auVar84._8_4_);
                auVar58._4_4_ = auVar58._8_4_;
                auVar58._0_4_ = auVar58._8_4_;
                auVar58._12_4_ = auVar58._8_4_;
                auVar144 = blendvps(auVar84,auVar52,auVar58);
                auVar52 = blendvps(auVar52,auVar84,auVar58);
                auVar59._8_4_ = -(uint)(auVar136._8_4_ < auVar104._8_4_);
                auVar59._4_4_ = auVar59._8_4_;
                auVar59._0_4_ = auVar59._8_4_;
                auVar59._12_4_ = auVar59._8_4_;
                auVar84 = blendvps(auVar104,auVar136,auVar59);
                auVar136 = blendvps(auVar136,auVar104,auVar59);
                auVar60._8_4_ = -(uint)(auVar136._8_4_ < auVar144._8_4_);
                auVar60._4_4_ = auVar60._8_4_;
                auVar60._0_4_ = auVar60._8_4_;
                auVar60._12_4_ = auVar60._8_4_;
                auVar104 = blendvps(auVar144,auVar136,auVar60);
                auVar136 = blendvps(auVar136,auVar144,auVar60);
                *pauVar42 = auVar52;
                pauVar42[1] = auVar136;
                pauVar42[2] = auVar104;
                uVar31 = auVar84._0_8_;
                pauVar42 = pauVar42 + 3;
                fVar180 = local_1228;
                fVar204 = fStack_1224;
                fVar159 = fStack_1220;
                fVar173 = fStack_121c;
                fVar185 = local_1238;
                fVar116 = fStack_1234;
                fVar131 = fStack_1230;
                fVar132 = fStack_122c;
              }
            }
          }
        }
        local_11e8 = (ulong)((uint)uVar31 & 0xf) - 8;
        uVar31 = uVar31 & 0xfffffffffffffff0;
        local_1048 = auVar175;
        local_11c8 = pauVar42;
        for (local_11e0 = 0; local_11e0 != local_11e8; local_11e0 = local_11e0 + 1) {
          lVar32 = local_11e0 * 0x58;
          local_11c0 = lVar32 + uVar31;
          uVar34 = *(undefined8 *)(uVar31 + 0x20 + lVar32);
          uVar7 = *(undefined8 *)(uVar31 + 0x24 + lVar32);
          bVar15 = (byte)uVar34;
          bVar51 = (byte)uVar7;
          bVar16 = (byte)((ulong)uVar34 >> 8);
          bVar78 = (byte)((ulong)uVar7 >> 8);
          bVar17 = (byte)((ulong)uVar34 >> 0x10);
          bVar79 = (byte)((ulong)uVar7 >> 0x10);
          bVar18 = (byte)((ulong)uVar34 >> 0x18);
          bVar80 = (byte)((ulong)uVar7 >> 0x18);
          bVar19 = (byte)((ulong)uVar34 >> 0x20);
          bVar81 = (byte)((ulong)uVar7 >> 0x20);
          bVar20 = (byte)((ulong)uVar34 >> 0x28);
          bVar82 = (byte)((ulong)uVar7 >> 0x28);
          bVar21 = (byte)((ulong)uVar34 >> 0x30);
          bVar83 = (byte)((ulong)uVar7 >> 0x30);
          bVar23 = (byte)((ulong)uVar7 >> 0x38);
          bVar22 = (byte)((ulong)uVar34 >> 0x38);
          auVar61[0] = -((byte)((bVar15 < bVar51) * bVar15 | (bVar15 >= bVar51) * bVar51) == bVar15)
          ;
          auVar61[1] = -((byte)((bVar16 < bVar78) * bVar16 | (bVar16 >= bVar78) * bVar78) == bVar16)
          ;
          auVar61[2] = -((byte)((bVar17 < bVar79) * bVar17 | (bVar17 >= bVar79) * bVar79) == bVar17)
          ;
          auVar61[3] = -((byte)((bVar18 < bVar80) * bVar18 | (bVar18 >= bVar80) * bVar80) == bVar18)
          ;
          auVar61[4] = -((byte)((bVar19 < bVar81) * bVar19 | (bVar19 >= bVar81) * bVar81) == bVar19)
          ;
          auVar61[5] = -((byte)((bVar20 < bVar82) * bVar20 | (bVar20 >= bVar82) * bVar82) == bVar20)
          ;
          auVar61[6] = -((byte)((bVar21 < bVar83) * bVar21 | (bVar21 >= bVar83) * bVar83) == bVar21)
          ;
          auVar61[7] = -((byte)((bVar22 < bVar23) * bVar22 | (bVar22 >= bVar23) * bVar23) == bVar22)
          ;
          auVar61[8] = 0xff;
          auVar61[9] = 0xff;
          auVar61[10] = 0xff;
          auVar61[0xb] = 0xff;
          auVar61[0xc] = 0xff;
          auVar61[0xd] = 0xff;
          auVar61[0xe] = 0xff;
          auVar61[0xf] = 0xff;
          fVar204 = *(float *)(uVar31 + 0x38 + lVar32);
          fVar180 = *(float *)(uVar31 + 0x3c + lVar32);
          fVar159 = *(float *)(uVar31 + 0x44 + lVar32);
          auVar86._8_8_ = 0;
          auVar86._0_8_ = *(ulong *)(local_11f0 + 0x20 + local_11c0);
          auVar87 = pmovzxbd(auVar86,auVar86);
          auVar106._8_8_ = 0;
          auVar106._0_8_ = *(ulong *)(local_11f8 + 0x20 + local_11c0);
          auVar52 = pmovzxbd(auVar106,auVar106);
          fVar173 = *(float *)(uVar31 + 0x48 + lVar32);
          auVar121._8_8_ = 0;
          auVar121._0_8_ = *(ulong *)(local_1200 + 0x20 + local_11c0);
          auVar84 = pmovzxbd(auVar121,auVar121);
          auVar122._8_8_ = 0;
          auVar122._0_8_ = *(ulong *)(local_1208 + 0x20 + local_11c0);
          auVar104 = pmovzxbd(auVar122,auVar122);
          fVar185 = *(float *)(uVar31 + 0x4c + lVar32);
          auVar137._8_8_ = 0;
          auVar137._0_8_ = *(ulong *)(local_1210 + 0x20 + local_11c0);
          auVar136 = pmovzxbd(auVar137,auVar137);
          auVar145._8_8_ = 0;
          auVar145._0_8_ = *(ulong *)(local_1218 + 0x20 + local_11c0);
          auVar144 = pmovzxbd(auVar145,auVar145);
          fVar116 = *(float *)(uVar31 + 0x40 + lVar32);
          auVar88._0_4_ = (((float)auVar87._0_4_ * fVar159 + fVar204) - auVar191._0_4_) * fVar169;
          auVar88._4_4_ = (((float)auVar87._4_4_ * fVar159 + fVar204) - auVar191._4_4_) * fVar142;
          auVar88._8_4_ = (((float)auVar87._8_4_ * fVar159 + fVar204) - auVar191._8_4_) * fVar151;
          auVar88._12_4_ = (((float)auVar87._12_4_ * fVar159 + fVar204) - auVar191._12_4_) * fVar139
          ;
          auVar154._0_4_ =
               (((float)auVar84._0_4_ * fVar173 + fVar180) - auVar182._0_4_) * auVar89._0_4_;
          auVar154._4_4_ =
               (((float)auVar84._4_4_ * fVar173 + fVar180) - auVar182._4_4_) * auVar89._4_4_;
          auVar154._8_4_ =
               (((float)auVar84._8_4_ * fVar173 + fVar180) - auVar182._8_4_) * auVar89._8_4_;
          auVar154._12_4_ =
               (((float)auVar84._12_4_ * fVar173 + fVar180) - auVar182._12_4_) * auVar89._12_4_;
          auVar89 = maxps(auVar88,auVar154);
          auVar107._0_4_ =
               (((float)auVar52._0_4_ * fVar159 + fVar204) - auVar191._0_4_) * local_1228;
          auVar107._4_4_ =
               (((float)auVar52._4_4_ * fVar159 + fVar204) - auVar191._4_4_) * fStack_1224;
          auVar107._8_4_ =
               (((float)auVar52._8_4_ * fVar159 + fVar204) - auVar191._8_4_) * fStack_1220;
          auVar107._12_4_ =
               (((float)auVar52._12_4_ * fVar159 + fVar204) - auVar191._12_4_) * fStack_121c;
          auVar123._0_4_ =
               (((float)auVar104._0_4_ * fVar173 + fVar180) - auVar182._0_4_) * local_1238;
          auVar123._4_4_ =
               (((float)auVar104._4_4_ * fVar173 + fVar180) - auVar182._4_4_) * fStack_1234;
          auVar123._8_4_ =
               (((float)auVar104._8_4_ * fVar173 + fVar180) - auVar182._8_4_) * fStack_1230;
          auVar123._12_4_ =
               (((float)auVar104._12_4_ * fVar173 + fVar180) - auVar182._12_4_) * fStack_122c;
          auVar182 = minps(auVar107,auVar123);
          auVar138._0_4_ =
               (((float)auVar136._0_4_ * fVar185 + fVar116) - auVar147._0_4_) * auVar170._0_4_;
          auVar138._4_4_ =
               (((float)auVar136._4_4_ * fVar185 + fVar116) - auVar147._4_4_) * auVar170._4_4_;
          auVar138._8_4_ =
               (((float)auVar136._8_4_ * fVar185 + fVar116) - auVar147._8_4_) * auVar170._8_4_;
          auVar138._12_4_ =
               (((float)auVar136._12_4_ * fVar185 + fVar116) - auVar147._12_4_) * auVar170._12_4_;
          auVar87 = maxps(auVar138,local_1198);
          local_f88 = maxps(auVar89,auVar87);
          auVar146._0_4_ = (((float)auVar144._0_4_ * fVar185 + fVar116) - auVar147._0_4_) * fVar187;
          auVar146._4_4_ = (((float)auVar144._4_4_ * fVar185 + fVar116) - auVar147._4_4_) * fVar133;
          auVar146._8_4_ = (((float)auVar144._8_4_ * fVar185 + fVar116) - auVar147._8_4_) * fVar134;
          auVar146._12_4_ =
               (((float)auVar144._12_4_ * fVar185 + fVar116) - auVar147._12_4_) * fVar141;
          auVar147 = minps(auVar146,auVar175);
          auVar182 = minps(auVar182,auVar147);
          auVar62._4_4_ = -(uint)(local_f88._4_4_ <= auVar182._4_4_);
          auVar62._0_4_ = -(uint)(local_f88._0_4_ <= auVar182._0_4_);
          auVar62._8_4_ = -(uint)(local_f88._8_4_ <= auVar182._8_4_);
          auVar62._12_4_ = -(uint)(local_f88._12_4_ <= auVar182._12_4_);
          auVar182 = pmovzxbd(auVar61 ^ _DAT_01f46b70,auVar61 ^ _DAT_01f46b70);
          auVar62 = ~auVar182 & auVar62;
          auVar63._0_4_ = auVar62._0_4_ << 0x1f;
          auVar63._4_4_ = auVar62._4_4_ << 0x1f;
          auVar63._8_4_ = auVar62._8_4_ << 0x1f;
          auVar63._12_4_ = auVar62._12_4_ << 0x1f;
          uVar29 = movmskps((int)lVar32,auVar63);
          local_1360 = CONCAT44((int)((ulong)lVar32 >> 0x20),uVar29);
          fVar180 = local_1228;
          fVar204 = fStack_1224;
          fVar159 = fStack_1220;
          fVar173 = fStack_121c;
          fVar185 = local_1238;
          fVar116 = fStack_1234;
          fVar131 = fStack_1230;
          fVar132 = fStack_122c;
LAB_006b86a1:
          auVar182 = _local_1318;
          if (local_1360 != 0) {
            lVar32 = 0;
            if (local_1360 != 0) {
              for (; (local_1360 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
              }
            }
            local_1360 = local_1360 & local_1360 - 1;
            fVar142 = (ray->super_RayK<1>).tfar;
            if (*(float *)(local_f88 + lVar32 * 4) <= fVar142) {
              local_f98 = ZEXT416((uint)fVar142);
              uVar9 = *(ushort *)(local_11c0 + lVar32 * 8);
              uVar10 = *(ushort *)(local_11c0 + 2 + lVar32 * 8);
              uVar28 = *(uint *)(local_11c0 + 0x50);
              local_14a4._4_8_ = ZEXT48(uVar28);
              uVar152 = *(uint *)(local_11c0 + 4 + lVar32 * 8);
              pSVar33 = context->scene;
              pGVar12 = (pSVar33->geometries).items[local_14a4._4_8_].ptr;
              lVar32 = *(long *)&pGVar12->field_0x58;
              lVar39 = *(long *)&pGVar12[1].time_range.upper;
              local_1460 = (ulong)uVar152;
              lVar45 = (ulong)uVar152 *
                       pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
              uVar36 = uVar9 & 0x7fff;
              uVar40 = uVar10 & 0x7fff;
              local_13d8._0_8_ = lVar32;
              local_13e8._0_8_ = lVar45;
              uVar30 = *(uint *)(lVar32 + 4 + lVar45);
              uVar43 = (ulong)uVar30;
              uVar44 = (ulong)(uVar30 * uVar40 + *(int *)(lVar32 + lVar45) + uVar36);
              p_Var13 = pGVar12[1].intersectionFilterN;
              pfVar6 = (float *)(lVar39 + (long)p_Var13 * uVar44);
              pfVar1 = (float *)(lVar39 + (uVar44 + 1) * (long)p_Var13);
              local_1318._0_4_ = *pfVar1;
              local_1078 = pfVar1[1];
              local_1168 = pfVar1[2];
              pfVar1 = (float *)(lVar39 + (uVar44 + uVar43) * (long)p_Var13);
              fVar204 = *pfVar1;
              fVar180 = pfVar1[2];
              lVar38 = uVar44 + uVar43 + 1;
              pfVar2 = (float *)(lVar39 + lVar38 * (long)p_Var13);
              local_13b8._0_4_ = *pfVar2;
              local_13c8 = pfVar2[1];
              local_1438._0_4_ = pfVar2[2];
              uVar37 = (ulong)(-1 < (short)uVar9);
              pfVar2 = (float *)(lVar39 + (uVar44 + uVar37 + 1) * (long)p_Var13);
              lVar46 = uVar37 + lVar38;
              uVar37 = 0;
              if (-1 < (short)uVar10) {
                uVar37 = uVar43;
              }
              pfVar3 = (float *)(lVar39 + lVar46 * (long)p_Var13);
              local_13b8._4_4_ = *pfVar3;
              fStack_13c4 = pfVar3[1];
              local_1438._4_4_ = pfVar3[2];
              pfVar3 = (float *)(lVar39 + (uVar44 + uVar43 + uVar37) * (long)p_Var13);
              pfVar4 = (float *)(lVar39 + (lVar38 + uVar37) * (long)p_Var13);
              local_13a4 = *pfVar4;
              fStack_13bc = pfVar4[1];
              pfVar5 = (float *)(lVar39 + (uVar37 + lVar46) * (long)p_Var13);
              fStack_13c0 = pfVar5[1];
              local_1318._4_4_ = *pfVar2;
              _fStack_1310 = auVar182._8_8_;
              auVar147 = _local_1318;
              local_1438 = CONCAT44(local_1438._4_4_,(float)local_1438);
              local_1428._4_4_ = pfVar4[2];
              local_1428._0_4_ = pfVar5[2];
              local_13b8 = CONCAT44(local_13b8._4_4_,(float)local_13b8);
              local_13a8 = *pfVar5;
              local_1478 = (ray->super_RayK<1>).org.field_0.m128[0];
              fVar159 = (ray->super_RayK<1>).org.field_0.m128[1];
              fVar173 = (ray->super_RayK<1>).org.field_0.m128[2];
              local_fa8 = pfVar6[1] - fVar159;
              fStack_fa4 = local_1078 - fVar159;
              fStack_fa0 = local_13c8 - fVar159;
              fStack_f9c = pfVar1[1] - fVar159;
              local_1378._0_4_ = pfVar6[2] - fVar173;
              local_1378._4_4_ = local_1168 - fVar173;
              fStack_1370 = (float)local_1438 - fVar173;
              fStack_136c = fVar180 - fVar173;
              fStack_1080 = fStack_13bc;
              fStack_107c = pfVar3[1];
              fVar141 = pfVar1[1] - fVar159;
              fVar151 = local_13c8 - fVar159;
              fVar169 = fStack_13bc - fVar159;
              fVar153 = pfVar3[1] - fVar159;
              local_1068 = CONCAT44((float)local_1438,fVar180);
              local_1458[0] = (uint)(fVar180 - fVar173);
              auStack_1454[0] = (uint)((float)local_1438 - fVar173);
              fStack_1450 = pfVar4[2] - fVar173;
              fStack_144c = pfVar3[2] - fVar173;
              local_1448 = fVar141;
              fStack_1444 = fVar151;
              fStack_1440 = fVar169;
              fStack_143c = fVar153;
              local_fd8 = fVar141 - local_fa8;
              fStack_fd4 = fVar151 - fStack_fa4;
              fStack_fd0 = fVar169 - fStack_fa0;
              fStack_fcc = fVar153 - fStack_f9c;
              local_fc8 = (float)local_1458[0] - (float)local_1378._0_4_;
              fStack_fc4 = (float)auStack_1454[0] - (float)local_1378._4_4_;
              fStack_fc0 = fStack_1450 - fStack_1370;
              fStack_fbc = fStack_144c - fStack_136c;
              aStack_1474.field_0.x = local_1478;
              aStack_1474.field_0.y = local_1478;
              aStack_1474.field_0.z = local_1478;
              local_1308 = *pfVar6 - local_1478;
              fStack_1304 = (float)local_1318._0_4_ - local_1478;
              fStack_1300 = (float)local_13b8 - local_1478;
              fStack_12fc = fVar204 - local_1478;
              local_1098 = CONCAT44((float)local_13b8,fVar204);
              local_1088 = local_13a4;
              fStack_1084 = *pfVar3;
              fVar204 = fVar204 - local_1478;
              fVar180 = (float)local_13b8 - local_1478;
              local_13a4 = local_13a4 - local_1478;
              fVar185 = *pfVar3 - local_1478;
              local_fe8 = fVar204 - local_1308;
              fStack_fe4 = fVar180 - fStack_1304;
              fStack_fe0 = local_13a4 - fStack_1300;
              fStack_fdc = fVar185 - fStack_12fc;
              local_1488._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
              auStack_1494._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
              local_12f8 = (ray->super_RayK<1>).dir.field_0.m128[2];
              local_1498 = (undefined1  [4])auStack_1494._0_4_;
              auStack_1494._4_4_ = auStack_1494._0_4_;
              fStack_148c = (float)auStack_1494._0_4_;
              fVar160 = (local_fd8 * ((float)local_1458[0] + (float)local_1378._0_4_) -
                        local_fc8 * (fVar141 + local_fa8)) * (float)local_1488._4_4_ +
                        (local_fc8 * (fVar204 + local_1308) -
                        ((float)local_1458[0] + (float)local_1378._0_4_) * local_fe8) *
                        (float)auStack_1494._0_4_ +
                        ((fVar141 + local_fa8) * local_fe8 - (fVar204 + local_1308) * local_fd8) *
                        local_12f8;
              fVar168 = (fStack_fd4 * ((float)auStack_1454[0] + (float)local_1378._4_4_) -
                        fStack_fc4 * (fVar151 + fStack_fa4)) * (float)local_1488._4_4_ +
                        (fStack_fc4 * (fVar180 + fStack_1304) -
                        ((float)auStack_1454[0] + (float)local_1378._4_4_) * fStack_fe4) *
                        (float)auStack_1494._0_4_ +
                        ((fVar151 + fStack_fa4) * fStack_fe4 - (fVar180 + fStack_1304) * fStack_fd4)
                        * local_12f8;
              local_1018._0_8_ = CONCAT44(fVar168,fVar160);
              local_1018._8_4_ =
                   (fStack_fd0 * (fStack_1450 + fStack_1370) - fStack_fc0 * (fVar169 + fStack_fa0))
                   * (float)local_1488._4_4_ +
                   (fStack_fc0 * (local_13a4 + fStack_1300) -
                   (fStack_1450 + fStack_1370) * fStack_fe0) * (float)auStack_1494._0_4_ +
                   ((fVar169 + fStack_fa0) * fStack_fe0 - (local_13a4 + fStack_1300) * fStack_fd0) *
                   local_12f8;
              local_1018._12_4_ =
                   (fStack_fcc * (fStack_144c + fStack_136c) - fStack_fbc * (fVar153 + fStack_f9c))
                   * (float)local_1488._4_4_ +
                   (fStack_fbc * (fVar185 + fStack_12fc) - (fStack_144c + fStack_136c) * fStack_fdc)
                   * (float)auStack_1494._0_4_ +
                   ((fVar153 + fStack_f9c) * fStack_fdc - (fVar185 + fStack_12fc) * fStack_fcc) *
                   local_12f8;
              fStack_1074 = pfVar2[1];
              fStack_1070 = fStack_13c4;
              fStack_106c = local_13c8;
              local_1348 = fVar159;
              fStack_1344 = fVar159;
              fStack_1340 = fVar159;
              fStack_133c = fVar159;
              local_1158 = local_1078 - fVar159;
              fStack_1154 = pfVar2[1] - fVar159;
              fStack_1150 = fStack_13c4 - fVar159;
              fStack_114c = local_13c8 - fVar159;
              local_1058 = CONCAT44(pfVar2[2],local_1168);
              local_1048._4_4_ = (float)local_1438;
              local_1048._0_4_ = local_1438._4_4_;
              local_1338 = fVar173;
              fStack_1334 = fVar173;
              fStack_1330 = fVar173;
              fStack_132c = fVar173;
              local_1168 = local_1168 - fVar173;
              fStack_1164 = pfVar2[2] - fVar173;
              fStack_1160 = local_1438._4_4_ - fVar173;
              fStack_115c = (float)local_1438 - fVar173;
              local_fb8 = local_fa8 - local_1158;
              fStack_fb4 = fStack_fa4 - fStack_1154;
              fStack_fb0 = fStack_fa0 - fStack_1150;
              fStack_fac = fStack_f9c - fStack_114c;
              fVar198 = (float)local_1378._0_4_ - local_1168;
              fVar201 = (float)local_1378._4_4_ - fStack_1164;
              fVar202 = fStack_1370 - fStack_1160;
              fVar203 = fStack_136c - fStack_115c;
              fStack_1310 = auVar182._8_4_;
              fStack_130c = auVar182._12_4_;
              local_1178 = (float)local_1318._0_4_ - local_1478;
              fStack_1174 = *pfVar2 - local_1478;
              fStack_1170 = fStack_1310 - local_1478;
              fStack_116c = fStack_130c - local_1478;
              fVar190 = local_1308 - local_1178;
              fVar193 = fStack_1304 - fStack_1174;
              fVar194 = fStack_1300 - fStack_1170;
              fVar195 = fStack_12fc - fStack_116c;
              local_1008._0_4_ =
                   (local_fb8 * ((float)local_1378._0_4_ + local_1168) -
                   fVar198 * (local_fa8 + local_1158)) * (float)local_1488._4_4_ +
                   (fVar198 * (local_1308 + local_1178) -
                   ((float)local_1378._0_4_ + local_1168) * fVar190) * (float)auStack_1494._0_4_ +
                   ((local_fa8 + local_1158) * fVar190 - (local_1308 + local_1178) * local_fb8) *
                   local_12f8;
              local_1008._4_4_ =
                   (fStack_fb4 * ((float)local_1378._4_4_ + fStack_1164) -
                   fVar201 * (fStack_fa4 + fStack_1154)) * (float)local_1488._4_4_ +
                   (fVar201 * (fStack_1304 + fStack_1174) -
                   ((float)local_1378._4_4_ + fStack_1164) * fVar193) * (float)auStack_1494._0_4_ +
                   ((fStack_fa4 + fStack_1154) * fVar193 - (fStack_1304 + fStack_1174) * fStack_fb4)
                   * local_12f8;
              local_1008._8_4_ =
                   (fStack_fb0 * (fStack_1370 + fStack_1160) - fVar202 * (fStack_fa0 + fStack_1150))
                   * (float)local_1488._4_4_ +
                   (fVar202 * (fStack_1300 + fStack_1170) - (fStack_1370 + fStack_1160) * fVar194) *
                   (float)auStack_1494._0_4_ +
                   ((fStack_fa0 + fStack_1150) * fVar194 - (fStack_1300 + fStack_1170) * fStack_fb0)
                   * local_12f8;
              local_1008._12_4_ =
                   (fStack_fac * (fStack_136c + fStack_115c) - fVar203 * (fStack_f9c + fStack_114c))
                   * (float)local_1488._4_4_ +
                   (fVar203 * (fStack_12fc + fStack_116c) - (fStack_136c + fStack_115c) * fVar195) *
                   (float)auStack_1494._0_4_ +
                   ((fStack_f9c + fStack_114c) * fVar195 - (fStack_12fc + fStack_116c) * fStack_fac)
                   * local_12f8;
              local_ff8 = local_1158 - fVar141;
              fStack_ff4 = fStack_1154 - fVar151;
              fStack_ff0 = fStack_1150 - fVar169;
              fStack_fec = fStack_114c - fVar153;
              fVar174 = local_1168 - (float)local_1458[0];
              fVar177 = fStack_1164 - (float)auStack_1454[0];
              fVar178 = fStack_1160 - fStack_1450;
              fVar179 = fStack_115c - fStack_144c;
              local_1328._0_4_ = local_1158 + fVar141;
              local_1328._4_4_ = fStack_1154 + fVar151;
              fStack_1320 = fStack_1150 + fVar169;
              fStack_131c = fStack_114c + fVar153;
              local_1148 = local_1168 + (float)local_1458[0];
              fStack_1144 = fStack_1164 + (float)auStack_1454[0];
              fStack_1140 = fStack_1160 + fStack_1450;
              fStack_113c = fStack_115c + fStack_144c;
              fVar181 = local_1178 - fVar204;
              fVar186 = fStack_1174 - fVar180;
              fVar188 = fStack_1170 - local_13a4;
              fVar189 = fStack_116c - fVar185;
              local_1358 = fVar204;
              fStack_1354 = fVar180;
              fStack_1350 = local_13a4;
              fStack_134c = fVar185;
              local_1138 = local_1178 + fVar204;
              fStack_1134 = fStack_1174 + fVar180;
              fStack_1130 = fStack_1170 + local_13a4;
              fStack_112c = fStack_116c + fVar185;
              fStack_12f4 = local_12f8;
              fStack_12f0 = local_12f8;
              fStack_12ec = local_12f8;
              local_1488._0_4_ = local_1488._4_4_;
              fStack_1480 = (float)local_1488._4_4_;
              fStack_147c = (float)local_1488._4_4_;
              auVar64._0_4_ =
                   (local_ff8 * local_1148 - fVar174 * (float)local_1328._0_4_) *
                   (float)local_1488._4_4_ +
                   (fVar174 * local_1138 - fVar181 * local_1148) * (float)auStack_1494._0_4_ +
                   (fVar181 * (float)local_1328._0_4_ - local_ff8 * local_1138) * local_12f8;
              auVar64._4_4_ =
                   (fStack_ff4 * fStack_1144 - fVar177 * (float)local_1328._4_4_) *
                   (float)local_1488._4_4_ +
                   (fVar177 * fStack_1134 - fVar186 * fStack_1144) * (float)auStack_1494._0_4_ +
                   (fVar186 * (float)local_1328._4_4_ - fStack_ff4 * fStack_1134) * local_12f8;
              auVar64._8_4_ =
                   (fStack_ff0 * fStack_1140 - fVar178 * fStack_1320) * (float)local_1488._4_4_ +
                   (fVar178 * fStack_1130 - fVar188 * fStack_1140) * (float)auStack_1494._0_4_ +
                   (fVar188 * fStack_1320 - fStack_ff0 * fStack_1130) * local_12f8;
              auVar64._12_4_ =
                   (fStack_fec * fStack_113c - fVar179 * fStack_131c) * (float)local_1488._4_4_ +
                   (fVar179 * fStack_112c - fVar189 * fStack_113c) * (float)auStack_1494._0_4_ +
                   (fVar189 * fStack_131c - fStack_fec * fStack_112c) * local_12f8;
              fVar134 = fVar160 + local_1008._0_4_ + auVar64._0_4_;
              fVar187 = fVar168 + local_1008._4_4_ + auVar64._4_4_;
              fVar139 = local_1018._8_4_ + local_1008._8_4_ + auVar64._8_4_;
              fVar140 = local_1018._12_4_ + local_1008._12_4_ + auVar64._12_4_;
              auVar108._8_4_ = local_1018._8_4_;
              auVar108._0_8_ = local_1018._0_8_;
              auVar108._12_4_ = local_1018._12_4_;
              auVar182 = minps(auVar108,local_1008);
              auVar182 = minps(auVar182,auVar64);
              auVar155._8_4_ = local_1018._8_4_;
              auVar155._0_8_ = local_1018._0_8_;
              auVar155._12_4_ = local_1018._12_4_;
              auVar89 = maxps(auVar155,local_1008);
              auVar89 = maxps(auVar89,auVar64);
              fVar116 = ABS(fVar134);
              fVar131 = ABS(fVar187);
              fVar132 = ABS(fVar139);
              fVar133 = ABS(fVar140);
              auVar156._0_4_ =
                   -(uint)(auVar89._0_4_ <= fVar116 * 1.1920929e-07 ||
                          -(fVar116 * 1.1920929e-07) <= auVar182._0_4_) & local_1188;
              auVar156._4_4_ =
                   -(uint)(auVar89._4_4_ <= fVar131 * 1.1920929e-07 ||
                          -(fVar131 * 1.1920929e-07) <= auVar182._4_4_) & uStack_1184;
              auVar156._8_4_ =
                   -(uint)(auVar89._8_4_ <= fVar132 * 1.1920929e-07 ||
                          -(fVar132 * 1.1920929e-07) <= auVar182._8_4_) & uStack_1180;
              auVar156._12_4_ =
                   -(uint)(auVar89._12_4_ <= fVar133 * 1.1920929e-07 ||
                          -(fVar133 * 1.1920929e-07) <= auVar182._12_4_) & uStack_117c;
              iVar41 = movmskps((int)lVar39,auVar156);
              local_1118 = ZEXT416(uVar36);
              local_1128 = ZEXT416(uVar40);
              _local_1318 = auVar147;
              if (iVar41 == 0) {
LAB_006b900a:
                uVar28 = (uint)pSVar33;
              }
              else {
                local_1028 = fVar134;
                fStack_1024 = fVar187;
                fStack_1020 = fVar139;
                fStack_101c = fVar140;
                local_1038 = fVar116;
                fStack_1034 = fVar131;
                fStack_1030 = fVar132;
                fStack_102c = fVar133;
                auVar109._0_4_ = local_fd8 * fVar198 - local_fc8 * local_fb8;
                auVar109._4_4_ = fStack_fd4 * fVar201 - fStack_fc4 * fStack_fb4;
                auVar109._8_4_ = fStack_fd0 * fVar202 - fStack_fc0 * fStack_fb0;
                auVar109._12_4_ = fStack_fcc * fVar203 - fStack_fbc * fStack_fac;
                auVar196._0_4_ = local_fb8 * fVar174 - fVar198 * local_ff8;
                auVar196._4_4_ = fStack_fb4 * fVar177 - fVar201 * fStack_ff4;
                auVar196._8_4_ = fStack_fb0 * fVar178 - fVar202 * fStack_ff0;
                auVar196._12_4_ = fStack_fac * fVar179 - fVar203 * fStack_fec;
                auVar65._4_4_ = -(uint)(ABS(fStack_fc4 * fStack_fb4) < ABS(fVar201 * fStack_ff4));
                auVar65._0_4_ = -(uint)(ABS(local_fc8 * local_fb8) < ABS(fVar198 * local_ff8));
                auVar65._8_4_ = -(uint)(ABS(fStack_fc0 * fStack_fb0) < ABS(fVar202 * fStack_ff0));
                auVar65._12_4_ = -(uint)(ABS(fStack_fbc * fStack_fac) < ABS(fVar203 * fStack_fec));
                local_1268 = blendvps(auVar196,auVar109,auVar65);
                auVar148._0_4_ = local_fc8 * fVar190 - local_fe8 * fVar198;
                auVar148._4_4_ = fStack_fc4 * fVar193 - fStack_fe4 * fVar201;
                auVar148._8_4_ = fStack_fc0 * fVar194 - fStack_fe0 * fVar202;
                auVar148._12_4_ = fStack_fbc * fVar195 - fStack_fdc * fVar203;
                auVar199._0_4_ = fVar198 * fVar181 - fVar190 * fVar174;
                auVar199._4_4_ = fVar201 * fVar186 - fVar193 * fVar177;
                auVar199._8_4_ = fVar202 * fVar188 - fVar194 * fVar178;
                auVar199._12_4_ = fVar203 * fVar189 - fVar195 * fVar179;
                auVar66._4_4_ = -(uint)(ABS(fStack_fe4 * fVar201) < ABS(fVar193 * fVar177));
                auVar66._0_4_ = -(uint)(ABS(local_fe8 * fVar198) < ABS(fVar190 * fVar174));
                auVar66._8_4_ = -(uint)(ABS(fStack_fe0 * fVar202) < ABS(fVar194 * fVar178));
                auVar66._12_4_ = -(uint)(ABS(fStack_fdc * fVar203) < ABS(fVar195 * fVar179));
                local_1258 = blendvps(auVar199,auVar148,auVar66);
                fVar181 = local_fb8 * fVar181;
                fVar186 = fStack_fb4 * fVar186;
                auVar90._0_4_ = local_fe8 * local_fb8 - local_fd8 * fVar190;
                auVar90._4_4_ = fStack_fe4 * fStack_fb4 - fStack_fd4 * fVar193;
                auVar90._8_4_ = fStack_fe0 * fStack_fb0 - fStack_fd0 * fVar194;
                auVar90._12_4_ = fStack_fdc * fStack_fac - fStack_fcc * fVar195;
                auVar192._0_4_ = fVar190 * local_ff8 - fVar181;
                auVar192._4_4_ = fVar193 * fStack_ff4 - fVar186;
                auVar192._8_4_ = fVar194 * fStack_ff0 - fStack_fb0 * fVar188;
                auVar192._12_4_ = fVar195 * fStack_fec - fStack_fac * fVar189;
                auVar161._0_8_ = CONCAT44(fVar186,fVar181) & 0x7fffffff7fffffff;
                auVar161._8_4_ = ABS(fStack_fb0 * fVar188);
                auVar161._12_4_ = ABS(fStack_fac * fVar189);
                auVar67._4_4_ = -(uint)(ABS(fStack_fd4 * fVar193) < ABS(fVar186));
                auVar67._0_4_ = -(uint)(ABS(local_fd8 * fVar190) < ABS(fVar181));
                auVar67._8_4_ = -(uint)(ABS(fStack_fd0 * fVar194) < auVar161._8_4_);
                auVar67._12_4_ = -(uint)(ABS(fStack_fcc * fVar195) < auVar161._12_4_);
                local_1248 = blendvps(auVar192,auVar90,auVar67);
                fVar181 = (float)local_1488._4_4_ * local_1268._0_4_ +
                          (float)auStack_1494._0_4_ * local_1258._0_4_ +
                          local_12f8 * local_1248._0_4_;
                fVar174 = (float)local_1488._4_4_ * local_1268._4_4_ +
                          (float)auStack_1494._0_4_ * local_1258._4_4_ +
                          local_12f8 * local_1248._4_4_;
                fVar177 = (float)local_1488._4_4_ * local_1268._8_4_ +
                          (float)auStack_1494._0_4_ * local_1258._8_4_ +
                          local_12f8 * local_1248._8_4_;
                fVar178 = (float)local_1488._4_4_ * local_1268._12_4_ +
                          (float)auStack_1494._0_4_ * local_1258._12_4_ +
                          local_12f8 * local_1248._12_4_;
                auVar68._0_4_ = fVar181 + fVar181;
                auVar68._4_4_ = fVar174 + fVar174;
                auVar68._8_4_ = fVar177 + fVar177;
                auVar68._12_4_ = fVar178 + fVar178;
                auVar124._0_4_ =
                     local_fa8 * local_1258._0_4_ + (float)local_1378._0_4_ * local_1248._0_4_;
                auVar124._4_4_ =
                     fStack_fa4 * local_1258._4_4_ + (float)local_1378._4_4_ * local_1248._4_4_;
                auVar124._8_4_ = fStack_fa0 * local_1258._8_4_ + fStack_1370 * local_1248._8_4_;
                auVar124._12_4_ = fStack_f9c * local_1258._12_4_ + fStack_136c * local_1248._12_4_;
                fVar179 = local_1308 * local_1268._0_4_ + auVar124._0_4_;
                fVar188 = fStack_1304 * local_1268._4_4_ + auVar124._4_4_;
                fVar189 = fStack_1300 * local_1268._8_4_ + auVar124._8_4_;
                fVar190 = fStack_12fc * local_1268._12_4_ + auVar124._12_4_;
                auVar182 = rcpps(auVar124,auVar68);
                fVar181 = auVar182._0_4_;
                fVar174 = auVar182._4_4_;
                fVar177 = auVar182._8_4_;
                fVar178 = auVar182._12_4_;
                auVar110._0_4_ =
                     ((1.0 - auVar68._0_4_ * fVar181) * fVar181 + fVar181) * (fVar179 + fVar179);
                auVar110._4_4_ =
                     ((1.0 - auVar68._4_4_ * fVar174) * fVar174 + fVar174) * (fVar188 + fVar188);
                auVar110._8_4_ =
                     ((1.0 - auVar68._8_4_ * fVar177) * fVar177 + fVar177) * (fVar189 + fVar189);
                auVar110._12_4_ =
                     ((1.0 - auVar68._12_4_ * fVar178) * fVar178 + fVar178) * (fVar190 + fVar190);
                fVar181 = (ray->super_RayK<1>).org.field_0.m128[3];
                iVar48 = -(uint)(fVar181 <= auVar110._4_4_);
                iVar49 = -(uint)(fVar181 <= auVar110._8_4_);
                iVar50 = -(uint)(fVar181 <= auVar110._12_4_);
                auVar149._8_4_ = iVar49;
                auVar149._4_4_ = iVar48;
                auVar149._12_4_ = iVar50;
                auVar69._0_4_ =
                     (int)((uint)(auVar68._0_4_ != 0.0 &&
                                 (auVar110._0_4_ <= fVar142 && fVar181 <= auVar110._0_4_)) *
                          -0x80000000) >> 0x1f;
                auVar69._4_4_ =
                     (int)((uint)(auVar68._4_4_ != 0.0 &&
                                 (auVar110._4_4_ <= fVar142 && fVar181 <= auVar110._4_4_)) *
                          -0x80000000) >> 0x1f;
                auVar69._8_4_ =
                     (int)((uint)(auVar68._8_4_ != 0.0 &&
                                 (auVar110._8_4_ <= fVar142 && fVar181 <= auVar110._8_4_)) *
                          -0x80000000) >> 0x1f;
                auVar69._12_4_ =
                     (int)((uint)(auVar68._12_4_ != 0.0 &&
                                 (auVar110._12_4_ <= fVar142 && fVar181 <= auVar110._12_4_)) *
                          -0x80000000) >> 0x1f;
                auVar70 = auVar69 & auVar156;
                iVar41 = movmskps(uVar36,auVar70);
                if (iVar41 == 0) goto LAB_006b900a;
                local_12c8._4_4_ = fVar187;
                local_12c8._0_4_ = fVar134;
                local_12c8._8_4_ = fVar139;
                local_12c8._12_4_ = fVar140;
                local_12b8 = &local_14a5;
                local_12a8 = auVar70;
                local_1278 = auVar110;
                auVar149._0_4_ = (float)(int)(*(ushort *)(lVar32 + 8 + lVar45) - 1);
                auVar157._4_4_ = iVar48;
                auVar157._0_4_ = auVar149._0_4_;
                auVar157._8_4_ = iVar49;
                auVar157._12_4_ = iVar50;
                auVar182 = rcpss(auVar157,auVar149);
                auVar162._4_12_ = auVar161._4_12_;
                auVar162._0_4_ = (float)(int)(*(ushort *)(lVar32 + 10 + lVar45) - 1);
                fStack_12dc = (2.0 - auVar149._0_4_ * auVar182._0_4_) * auVar182._0_4_;
                auVar158._4_4_ = ABS(fVar186);
                auVar158._0_4_ = auVar162._0_4_;
                auVar158._8_4_ = auVar161._8_4_;
                auVar158._12_4_ = auVar161._12_4_;
                auVar182 = rcpss(auVar158,auVar162);
                fVar142 = (2.0 - auVar162._0_4_ * auVar182._0_4_) * auVar182._0_4_;
                local_12e8._0_4_ = fStack_12dc * (fVar160 + (float)uVar36 * fVar134);
                local_12e8._4_4_ = fStack_12dc * (fVar168 + (float)(uVar36 + 1) * fVar187);
                fStack_12e0 = fStack_12dc * (local_1018._8_4_ + (float)(uVar36 + 1) * fVar139);
                fStack_12dc = fStack_12dc * (local_1018._12_4_ + (float)uVar36 * fVar140);
                auVar91._0_4_ = (float)uVar40 * fVar134 + local_1008._0_4_;
                auVar91._4_4_ = (float)uVar40 * fVar187 + local_1008._4_4_;
                auVar91._8_4_ = (float)(uVar40 + 1) * fVar139 + local_1008._8_4_;
                auVar91._12_4_ = (float)(uVar40 + 1) * fVar140 + local_1008._12_4_;
                local_12d8._4_4_ = fVar142 * auVar91._4_4_;
                local_12d8._0_4_ = fVar142 * auVar91._0_4_;
                fStack_12d0 = fVar142 * auVar91._8_4_;
                fStack_12cc = fVar142 * auVar91._12_4_;
                pGVar12 = (pSVar33->geometries).items[local_14a4._4_8_].ptr;
                uVar30 = (ray->super_RayK<1>).mask;
                pSVar33 = (Scene *)(ulong)uVar30;
                if ((pGVar12->mask & uVar30) == 0) goto LAB_006b900a;
                _local_1428 = auVar70;
                auVar182 = rcpps(auVar91,local_12c8);
                fVar160 = auVar182._0_4_;
                fVar181 = auVar182._4_4_;
                fVar168 = auVar182._8_4_;
                fVar186 = auVar182._12_4_;
                fVar116 = (float)(-(uint)(1e-18 <= fVar116) &
                                 (uint)(((float)DAT_01f46a60 - fVar134 * fVar160) * fVar160 +
                                       fVar160));
                fVar131 = (float)(-(uint)(1e-18 <= fVar131) &
                                 (uint)((DAT_01f46a60._4_4_ - fVar187 * fVar181) * fVar181 + fVar181
                                       ));
                fVar132 = (float)(-(uint)(1e-18 <= fVar132) &
                                 (uint)((DAT_01f46a60._8_4_ - fVar139 * fVar168) * fVar168 + fVar168
                                       ));
                fVar133 = (float)(-(uint)(1e-18 <= fVar133) &
                                 (uint)((DAT_01f46a60._12_4_ - fVar140 * fVar186) * fVar186 +
                                       fVar186));
                auVar125._0_4_ = (float)local_12e8._0_4_ * fVar116;
                auVar125._4_4_ = (float)local_12e8._4_4_ * fVar131;
                auVar125._8_4_ = fStack_12e0 * fVar132;
                auVar125._12_4_ = fStack_12dc * fVar133;
                local_1298 = minps(auVar125,_DAT_01f46a60);
                auVar150._0_4_ = fVar142 * auVar91._0_4_ * fVar116;
                auVar150._4_4_ = fVar142 * auVar91._4_4_ * fVar131;
                auVar150._8_4_ = fVar142 * auVar91._8_4_ * fVar132;
                auVar150._12_4_ = fVar142 * auVar91._12_4_ * fVar133;
                local_1288 = minps(auVar150,_DAT_01f46a60);
                auVar147 = blendvps(_DAT_01f45a30,auVar110,auVar70);
                auVar111._4_4_ = auVar147._0_4_;
                auVar111._0_4_ = auVar147._4_4_;
                auVar111._8_4_ = auVar147._12_4_;
                auVar111._12_4_ = auVar147._8_4_;
                auVar182 = minps(auVar111,auVar147);
                auVar92._0_8_ = auVar182._8_8_;
                auVar92._8_4_ = auVar182._0_4_;
                auVar92._12_4_ = auVar182._4_4_;
                auVar182 = minps(auVar92,auVar182);
                auVar93._0_8_ =
                     CONCAT44(-(uint)(auVar182._4_4_ == auVar147._4_4_) & auVar70._4_4_,
                              -(uint)(auVar182._0_4_ == auVar147._0_4_) & auVar70._0_4_);
                auVar93._8_4_ = -(uint)(auVar182._8_4_ == auVar147._8_4_) & auVar70._8_4_;
                auVar93._12_4_ = -(uint)(auVar182._12_4_ == auVar147._12_4_) & auVar70._12_4_;
                iVar41 = movmskps(uVar30,auVar93);
                if (iVar41 != 0) {
                  auVar70._8_4_ = auVar93._8_4_;
                  auVar70._0_8_ = auVar93._0_8_;
                  auVar70._12_4_ = auVar93._12_4_;
                }
                uVar30 = movmskps(iVar41,auVar70);
                lVar39 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                  }
                }
                pRVar14 = context->args;
                if ((pRVar14->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar116 = *(float *)(local_1298 + lVar39 * 4);
                  fVar131 = *(float *)(local_1288 + lVar39 * 4);
                  fVar132 = *(float *)(local_1268 + lVar39 * 4);
                  fVar133 = *(float *)(local_1258 + lVar39 * 4);
                  fVar134 = *(float *)(local_1248 + lVar39 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_1278 + lVar39 * 4);
                  (ray->Ng).field_0.field_0.x = fVar132;
                  (ray->Ng).field_0.field_0.y = fVar133;
                  (ray->Ng).field_0.field_0.z = fVar134;
                  ray->u = fVar116;
                  ray->v = fVar131;
                  ray->primID = uVar152;
                  ray->geomID = uVar28;
                  pRVar47 = context->user;
                  ray->instID[0] = pRVar47->instID[0];
                  uVar28 = pRVar47->instPrimID[0];
                  ray->instPrimID[0] = uVar28;
                }
                else {
                  pRVar47 = context->user;
                  _local_1498 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
                  _local_1488 = auVar110;
                  while( true ) {
                    local_139c = *(undefined4 *)(local_1298 + lVar39 * 4);
                    local_1398 = *(undefined4 *)(local_1288 + lVar39 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1278 + lVar39 * 4);
                    local_13a8 = *(float *)(local_1268 + lVar39 * 4);
                    local_13a4 = (float)*(undefined4 *)(local_1258 + lVar39 * 4);
                    local_13a0 = *(undefined4 *)(local_1248 + lVar39 * 4);
                    local_1394 = (int)local_1460;
                    local_1390 = (int)local_14a4._4_8_;
                    local_138c = pRVar47->instID[0];
                    local_1388 = pRVar47->instPrimID[0];
                    local_14a4._0_4_ = -NAN;
                    local_1418.valid = (int *)local_14a4;
                    local_1418.geometryUserPtr = pGVar12->userPtr;
                    local_1418.context = pRVar47;
                    local_1418.ray = (RTCRayN *)ray;
                    local_1418.hit = (RTCHitN *)&local_13a8;
                    local_1418.N = 1;
                    if (((pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar12->intersectionFilterN)(&local_1418), auVar110 = _local_1488,
                        (((RayK<1> *)local_1418.valid)->org).field_0.m128[0] != 0.0)) &&
                       ((pRVar14->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((pGVar12->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*pRVar14->filter)(&local_1418), auVar110 = _local_1488,
                         (((RayK<1> *)local_1418.valid)->org).field_0.m128[0] != 0.0)))))) {
                      (((Vec3f *)((long)local_1418.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1418.hit;
                      (((Vec3f *)((long)local_1418.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1418.hit + 4);
                      (((Vec3f *)((long)local_1418.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1418.hit + 8);
                      *(float *)((long)local_1418.ray + 0x3c) = *(float *)(local_1418.hit + 0xc);
                      *(float *)((long)local_1418.ray + 0x40) = *(float *)(local_1418.hit + 0x10);
                      *(float *)((long)local_1418.ray + 0x44) = *(float *)(local_1418.hit + 0x14);
                      *(float *)((long)local_1418.ray + 0x48) = *(float *)(local_1418.hit + 0x18);
                      *(float *)((long)local_1418.ray + 0x4c) = *(float *)(local_1418.hit + 0x1c);
                      *(float *)((long)local_1418.ray + 0x50) = *(float *)(local_1418.hit + 0x20);
                      pRVar35 = (RayHit *)local_1418.ray;
                    }
                    else {
                      (ray->super_RayK<1>).tfar = (float)local_1498;
                      pRVar35 = (RayHit *)local_1418.valid;
                      auVar110 = _local_1488;
                    }
                    *(undefined4 *)(local_1428 + lVar39 * 4) = 0;
                    fVar204 = (ray->super_RayK<1>).tfar;
                    auVar76._0_4_ = -(uint)(auVar110._0_4_ <= fVar204) & local_1428._0_4_;
                    auVar76._4_4_ = -(uint)(auVar110._4_4_ <= fVar204) & local_1428._4_4_;
                    auVar76._8_4_ = -(uint)(auVar110._8_4_ <= fVar204) & uStack_1420;
                    auVar76._12_4_ = -(uint)(auVar110._12_4_ <= fVar204) & uStack_141c;
                    _local_1428 = auVar76;
                    iVar41 = movmskps((int)pRVar35,auVar76);
                    if (iVar41 == 0) break;
                    local_1498 = (undefined1  [4])(ray->super_RayK<1>).tfar;
                    auStack_1494._0_4_ = (ray->super_RayK<1>).mask;
                    auStack_1494._4_4_ = (ray->super_RayK<1>).id;
                    fStack_148c = (float)(ray->super_RayK<1>).flags;
                    auVar147 = blendvps(_DAT_01f45a30,auVar110,auVar76);
                    auVar129._4_4_ = auVar147._0_4_;
                    auVar129._0_4_ = auVar147._4_4_;
                    auVar129._8_4_ = auVar147._12_4_;
                    auVar129._12_4_ = auVar147._8_4_;
                    auVar182 = minps(auVar129,auVar147);
                    auVar99._0_8_ = auVar182._8_8_;
                    auVar99._8_4_ = auVar182._0_4_;
                    auVar99._12_4_ = auVar182._4_4_;
                    auVar182 = minps(auVar99,auVar182);
                    auVar100._0_8_ =
                         CONCAT44(-(uint)(auVar182._4_4_ == auVar147._4_4_) & auVar76._4_4_,
                                  -(uint)(auVar182._0_4_ == auVar147._0_4_) & auVar76._0_4_);
                    auVar100._8_4_ = -(uint)(auVar182._8_4_ == auVar147._8_4_) & auVar76._8_4_;
                    auVar100._12_4_ = -(uint)(auVar182._12_4_ == auVar147._12_4_) & auVar76._12_4_;
                    iVar41 = movmskps(iVar41,auVar100);
                    if (iVar41 != 0) {
                      auVar76._8_4_ = auVar100._8_4_;
                      auVar76._0_8_ = auVar100._0_8_;
                      auVar76._12_4_ = auVar100._12_4_;
                    }
                    uVar29 = movmskps(iVar41,auVar76);
                    uVar37 = CONCAT44((int)((ulong)pRVar35 >> 0x20),uVar29);
                    lVar39 = 0;
                    if (uVar37 != 0) {
                      for (; (uVar37 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                      }
                    }
                  }
                  local_1478 = (ray->super_RayK<1>).org.field_0.m128[0];
                  fVar159 = (ray->super_RayK<1>).org.field_0.m128[1];
                  fVar173 = (ray->super_RayK<1>).org.field_0.m128[2];
                  local_1488._4_4_ = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
                  auStack_1494._0_4_ = *(float *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
                  local_12f8 = (ray->super_RayK<1>).dir.field_0.m128[2];
                  local_1488._0_4_ = local_1488._4_4_;
                  fStack_1480 = (float)local_1488._4_4_;
                  fStack_147c = (float)local_1488._4_4_;
                  fVar204 = (float)local_1098 - local_1478;
                  fVar180 = local_1098._4_4_ - local_1478;
                  local_13a4 = fStack_1090 - local_1478;
                  fVar185 = fStack_108c - local_1478;
                  fVar141 = local_1088 - fVar159;
                  fVar151 = fStack_1084 - fVar159;
                  fVar169 = fStack_1080 - fVar159;
                  fVar153 = fStack_107c - fVar159;
                  local_1458[0] = (uint)((float)local_1068 - fVar173);
                  auStack_1454[0] = (uint)(local_1068._4_4_ - fVar173);
                  fStack_1450 = fStack_1060 - fVar173;
                  fStack_144c = fStack_105c - fVar173;
                  local_1138 = fVar204 + ((float)local_1318._0_4_ - local_1478);
                  fStack_1134 = fVar180 + ((float)local_1318._4_4_ - local_1478);
                  fStack_1130 = local_13a4 + (fStack_1310 - local_1478);
                  fStack_112c = fVar185 + (fStack_130c - local_1478);
                  local_1328._4_4_ = fVar151 + (fStack_1074 - fVar159);
                  local_1328._0_4_ = fVar141 + (local_1078 - fVar159);
                  fStack_1320 = fVar169 + (fStack_1070 - fVar159);
                  fStack_131c = fVar153 + (fStack_106c - fVar159);
                  local_1148 = (float)local_1458[0] + ((float)local_1058 - fVar173);
                  fStack_1144 = (float)auStack_1454[0] + (local_1058._4_4_ - fVar173);
                  fStack_1140 = fStack_1450 + (fStack_1050 - fVar173);
                  fStack_113c = fStack_144c + (fStack_104c - fVar173);
                  local_1168 = (float)local_1058 - fVar173;
                  fStack_1164 = local_1058._4_4_ - fVar173;
                  fStack_1160 = fStack_1050 - fVar173;
                  fStack_115c = fStack_104c - fVar173;
                  local_1158 = local_1078 - fVar159;
                  fStack_1154 = fStack_1074 - fVar159;
                  fStack_1150 = fStack_1070 - fVar159;
                  fStack_114c = fStack_106c - fVar159;
                  local_1178 = (float)local_1318._0_4_ - local_1478;
                  fStack_1174 = (float)local_1318._4_4_ - local_1478;
                  fStack_1170 = fStack_1310 - local_1478;
                  fStack_116c = fStack_130c - local_1478;
                  uVar28 = 0;
                  context = local_1368;
                }
                local_1498 = (undefined1  [4])auStack_1494._0_4_;
                auStack_1494._4_4_ = auStack_1494._0_4_;
                fStack_148c = (float)auStack_1494._0_4_;
                fStack_12f4 = local_12f8;
                fStack_12f0 = local_12f8;
                fStack_12ec = local_12f8;
                lVar32 = local_13d8._0_8_;
                lVar45 = local_13e8._0_8_;
              }
              local_1438._0_4_ = (float)local_1438 - fVar173;
              local_1438._4_4_ = local_1438._4_4_ - fVar173;
              fStack_1430 = fStack_1430 - fVar173;
              fStack_142c = fStack_142c - fVar173;
              local_13c8 = local_13c8 - fVar159;
              fStack_13c4 = fStack_13c4 - fVar159;
              fStack_13c0 = fStack_13c0 - fVar159;
              fStack_13bc = fStack_13bc - fVar159;
              local_13b8._0_4_ = (float)local_13b8 - local_1478;
              local_13b8._4_4_ = local_13b8._4_4_ - local_1478;
              fStack_13b0 = fStack_13b0 - local_1478;
              fStack_13ac = fStack_13ac - local_1478;
              local_1308 = local_1178 - (float)local_13b8;
              fStack_1304 = fStack_1174 - local_13b8._4_4_;
              fStack_1300 = fStack_1170 - fStack_13b0;
              fStack_12fc = fStack_116c - fStack_13ac;
              fVar193 = local_1158 - local_13c8;
              fVar195 = fStack_1154 - fStack_13c4;
              fVar201 = fStack_1150 - fStack_13c0;
              fVar203 = fStack_114c - fStack_13bc;
              local_1448 = local_1168 - (float)local_1438;
              fStack_1444 = fStack_1164 - local_1438._4_4_;
              fStack_1440 = fStack_1160 - fStack_1430;
              fStack_143c = fStack_115c - fStack_142c;
              local_1378._0_4_ = fVar141 - local_1158;
              local_1378._4_4_ = fVar151 - fStack_1154;
              fStack_1370 = fVar169 - fStack_1150;
              fStack_136c = fVar153 - fStack_114c;
              fVar142 = (float)local_1458[0] - local_1168;
              fVar139 = (float)auStack_1454[0] - fStack_1164;
              fVar140 = fStack_1450 - fStack_1160;
              fVar160 = fStack_144c - fStack_115c;
              local_13d8._0_4_ = fVar204 - local_1178;
              local_13d8._4_4_ = fVar180 - fStack_1174;
              local_13d8._8_4_ = local_13a4 - fStack_1170;
              local_13d8._12_4_ = fVar185 - fStack_116c;
              local_1478 = fVar193;
              aStack_1474.field_0.x = fVar195;
              aStack_1474.field_0.y = fVar201;
              aStack_1474.field_0.z = fVar203;
              fVar181 = local_13c8 - fVar141;
              fVar168 = fStack_13c4 - fVar151;
              fVar186 = fStack_13c0 - fVar169;
              fVar174 = fStack_13bc - fVar153;
              fVar194 = (float)local_1438 - (float)local_1458[0];
              fVar198 = local_1438._4_4_ - (float)auStack_1454[0];
              fVar202 = fStack_1430 - fStack_1450;
              fVar206 = fStack_142c - fStack_144c;
              fVar189 = (fVar193 * (local_1168 + (float)local_1438) -
                        local_1448 * (local_1158 + local_13c8)) * (float)local_1488._0_4_ +
                        (local_1448 * (local_1178 + (float)local_13b8) -
                        (local_1168 + (float)local_1438) * local_1308) * (float)local_1498 +
                        ((local_1158 + local_13c8) * local_1308 -
                        (local_1178 + (float)local_13b8) * fVar193) * fStack_12ec;
              fVar190 = (fVar195 * (fStack_1164 + local_1438._4_4_) -
                        fStack_1444 * (fStack_1154 + fStack_13c4)) * (float)local_1488._4_4_ +
                        (fStack_1444 * (fStack_1174 + local_13b8._4_4_) -
                        (fStack_1164 + local_1438._4_4_) * fStack_1304) * (float)auStack_1494._0_4_
                        + ((fStack_1154 + fStack_13c4) * fStack_1304 -
                          (fStack_1174 + local_13b8._4_4_) * fVar195) * fStack_12ec;
              local_13e8._0_8_ = CONCAT44(fVar190,fVar189);
              local_13e8._8_4_ =
                   (fVar201 * (fStack_1160 + fStack_1430) -
                   fStack_1440 * (fStack_1150 + fStack_13c0)) * fStack_1480 +
                   (fStack_1440 * (fStack_1170 + fStack_13b0) -
                   (fStack_1160 + fStack_1430) * fStack_1300) * (float)auStack_1494._4_4_ +
                   ((fStack_1150 + fStack_13c0) * fStack_1300 -
                   (fStack_1170 + fStack_13b0) * fVar201) * fStack_12ec;
              local_13e8._12_4_ =
                   (fVar203 * (fStack_115c + fStack_142c) -
                   fStack_143c * (fStack_114c + fStack_13bc)) * fStack_147c +
                   (fStack_143c * (fStack_116c + fStack_13ac) -
                   (fStack_115c + fStack_142c) * fStack_12fc) * fStack_148c +
                   ((fStack_114c + fStack_13bc) * fStack_12fc -
                   (fStack_116c + fStack_13ac) * fVar203) * fStack_12ec;
              fVar177 = (float)local_13b8 - fVar204;
              fVar178 = local_13b8._4_4_ - fVar180;
              fVar179 = fStack_13b0 - local_13a4;
              fVar188 = fStack_13ac - fVar185;
              auVar197._0_4_ =
                   (fVar181 * ((float)local_1458[0] + (float)local_1438) -
                   fVar194 * (fVar141 + local_13c8)) * (float)local_1488._0_4_ +
                   (fVar194 * (fVar204 + (float)local_13b8) -
                   ((float)local_1458[0] + (float)local_1438) * fVar177) * (float)local_1498 +
                   ((fVar141 + local_13c8) * fVar177 - (fVar204 + (float)local_13b8) * fVar181) *
                   fStack_12ec;
              auVar197._4_4_ =
                   (fVar168 * ((float)auStack_1454[0] + local_1438._4_4_) -
                   fVar198 * (fVar151 + fStack_13c4)) * (float)local_1488._4_4_ +
                   (fVar198 * (fVar180 + local_13b8._4_4_) -
                   ((float)auStack_1454[0] + local_1438._4_4_) * fVar178) *
                   (float)auStack_1494._0_4_ +
                   ((fVar151 + fStack_13c4) * fVar178 - (fVar180 + local_13b8._4_4_) * fVar168) *
                   fStack_12ec;
              auVar197._8_4_ =
                   (fVar186 * (fStack_1450 + fStack_1430) - fVar202 * (fVar169 + fStack_13c0)) *
                   fStack_1480 +
                   (fVar202 * (local_13a4 + fStack_13b0) - (fStack_1450 + fStack_1430) * fVar179) *
                   (float)auStack_1494._4_4_ +
                   ((fVar169 + fStack_13c0) * fVar179 - (local_13a4 + fStack_13b0) * fVar186) *
                   fStack_12ec;
              auVar197._12_4_ =
                   (fVar174 * (fStack_144c + fStack_142c) - fVar206 * (fVar153 + fStack_13bc)) *
                   fStack_147c +
                   (fVar206 * (fVar185 + fStack_13ac) - (fStack_144c + fStack_142c) * fVar188) *
                   fStack_148c +
                   ((fVar153 + fStack_13bc) * fVar188 - (fVar185 + fStack_13ac) * fVar174) *
                   fStack_12ec;
              local_1458[0] = (uint)fVar142;
              auStack_1454[0] = (uint)fVar139;
              fStack_1450 = fVar140;
              fStack_144c = fVar160;
              auVar71._0_4_ =
                   ((float)local_1378._0_4_ * local_1148 - fVar142 * (float)local_1328._0_4_) *
                   (float)local_1488._0_4_ +
                   (fVar142 * local_1138 - local_1148 * local_13d8._0_4_) * (float)local_1498 +
                   ((float)local_1328._0_4_ * local_13d8._0_4_ -
                   local_1138 * (float)local_1378._0_4_) * fStack_12ec;
              auVar71._4_4_ =
                   ((float)local_1378._4_4_ * fStack_1144 - fVar139 * (float)local_1328._4_4_) *
                   (float)local_1488._4_4_ +
                   (fVar139 * fStack_1134 - fStack_1144 * local_13d8._4_4_) *
                   (float)auStack_1494._0_4_ +
                   ((float)local_1328._4_4_ * local_13d8._4_4_ -
                   fStack_1134 * (float)local_1378._4_4_) * fStack_12ec;
              auVar71._8_4_ =
                   (fStack_1370 * fStack_1140 - fVar140 * fStack_1320) * fStack_1480 +
                   (fVar140 * fStack_1130 - fStack_1140 * local_13d8._8_4_) *
                   (float)auStack_1494._4_4_ +
                   (fStack_1320 * local_13d8._8_4_ - fStack_1130 * fStack_1370) * fStack_12ec;
              auVar71._12_4_ =
                   (fStack_136c * fStack_113c - fVar160 * fStack_131c) * fStack_147c +
                   (fVar160 * fStack_112c - fStack_113c * local_13d8._12_4_) * fStack_148c +
                   (fStack_131c * local_13d8._12_4_ - fStack_112c * fStack_136c) * fStack_12ec;
              local_12c8._0_4_ = fVar189 + auVar197._0_4_ + auVar71._0_4_;
              local_12c8._4_4_ = fVar190 + auVar197._4_4_ + auVar71._4_4_;
              local_12c8._8_4_ = local_13e8._8_4_ + auVar197._8_4_ + auVar71._8_4_;
              local_12c8._12_4_ = local_13e8._12_4_ + auVar197._12_4_ + auVar71._12_4_;
              uVar37 = CONCAT44(local_12c8._4_4_,local_12c8._0_4_);
              local_1328 = (undefined1  [8])(uVar37 & 0x7fffffff7fffffff);
              fStack_1320 = ABS(local_12c8._8_4_);
              fStack_131c = ABS(local_12c8._12_4_);
              auVar112._8_4_ = local_13e8._8_4_;
              auVar112._0_8_ = local_13e8._0_8_;
              auVar112._12_4_ = local_13e8._12_4_;
              auVar182 = minps(auVar112,auVar197);
              auVar89 = minps(auVar182,auVar71);
              auVar94._8_4_ = local_13e8._8_4_;
              auVar94._0_8_ = local_13e8._0_8_;
              auVar94._12_4_ = local_13e8._12_4_;
              auVar182 = maxps(auVar94,auVar197);
              auVar147 = maxps(auVar182,auVar71);
              auVar182 = _local_1328;
              auVar95._4_4_ = -(uint)(auVar147._4_4_ <= ABS(local_12c8._4_4_) * 1.1920929e-07);
              auVar95._0_4_ = -(uint)(auVar147._0_4_ <= ABS(local_12c8._0_4_) * 1.1920929e-07);
              auVar95._8_4_ = -(uint)(auVar147._8_4_ <= fStack_1320 * 1.1920929e-07);
              auVar95._12_4_ = -(uint)(auVar147._12_4_ <= fStack_131c * 1.1920929e-07);
              auVar113._4_4_ = -(uint)(-(ABS(local_12c8._4_4_) * 1.1920929e-07) <= auVar89._4_4_);
              auVar113._0_4_ = -(uint)(-(ABS(local_12c8._0_4_) * 1.1920929e-07) <= auVar89._0_4_);
              auVar113._8_4_ = -(uint)(-(fStack_1320 * 1.1920929e-07) <= auVar89._8_4_);
              auVar113._12_4_ = -(uint)(-(fStack_131c * 1.1920929e-07) <= auVar89._12_4_);
              auVar95 = auVar95 | auVar113;
              auVar96._0_4_ = auVar95._0_4_ & local_1188;
              auVar96._4_4_ = auVar95._4_4_ & uStack_1184;
              auVar96._8_4_ = auVar95._8_4_ & uStack_1180;
              auVar96._12_4_ = auVar95._12_4_ & uStack_117c;
              iVar41 = movmskps(uVar28,auVar96);
              uVar37 = local_11d8;
              pauVar42 = local_11c8;
              uVar43 = local_11d0;
              auVar175 = local_1048;
              fVar180 = local_1228;
              fVar204 = fStack_1224;
              fVar159 = fStack_1220;
              fVar173 = fStack_121c;
              fVar185 = local_1238;
              fVar116 = fStack_1234;
              fVar131 = fStack_1230;
              fVar132 = fStack_122c;
              fVar187 = local_10a8;
              fVar133 = fStack_10a4;
              fVar134 = fStack_10a0;
              fVar141 = fStack_109c;
              if (iVar41 != 0) {
                _local_1318 = auVar197;
                local_1478 = fVar193 * fVar194 - local_1448 * fVar181;
                aStack_1474.field_0.x = fVar195 * fVar198 - fStack_1444 * fVar168;
                aStack_1474.field_0.y = fVar201 * fVar202 - fStack_1440 * fVar186;
                aStack_1474.field_0.z = fVar203 * fVar206 - fStack_143c * fVar174;
                auVar171._0_4_ = fVar181 * fVar142 - fVar194 * (float)local_1378._0_4_;
                auVar171._4_4_ = fVar168 * fVar139 - fVar198 * (float)local_1378._4_4_;
                auVar171._8_4_ = fVar186 * fVar140 - fVar202 * fStack_1370;
                auVar171._12_4_ = fVar174 * fVar160 - fVar206 * fStack_136c;
                uVar28 = (uint)DAT_01f46710;
                uVar152 = DAT_01f46710._4_4_;
                uVar30 = DAT_01f46710._8_4_;
                uVar36 = DAT_01f46710._12_4_;
                auVar72._4_4_ =
                     -(uint)((float)((uint)(fStack_1444 * fVar168) & uVar152) <
                            (float)((uint)(fVar198 * (float)local_1378._4_4_) & uVar152));
                auVar72._0_4_ =
                     -(uint)((float)((uint)(local_1448 * fVar181) & uVar28) <
                            (float)((uint)(fVar194 * (float)local_1378._0_4_) & uVar28));
                auVar72._8_4_ =
                     -(uint)((float)((uint)(fStack_1440 * fVar186) & uVar30) <
                            (float)((uint)(fVar202 * fStack_1370) & uVar30));
                auVar72._12_4_ =
                     -(uint)((float)((uint)(fStack_143c * fVar174) & uVar36) <
                            (float)((uint)(fVar206 * fStack_136c) & uVar36));
                auVar26._4_4_ = aStack_1474.field_0.x;
                auVar26._0_4_ = local_1478;
                auVar26._8_4_ = aStack_1474.field_0.y;
                auVar26._12_4_ = aStack_1474.field_0.z;
                local_1268 = blendvps(auVar171,auVar26,auVar72);
                auVar183._0_4_ = local_1448 * fVar177 - local_1308 * fVar194;
                auVar183._4_4_ = fStack_1444 * fVar178 - fStack_1304 * fVar198;
                auVar183._8_4_ = fStack_1440 * fVar179 - fStack_1300 * fVar202;
                auVar183._12_4_ = fStack_143c * fVar188 - fStack_12fc * fVar206;
                auVar205._0_4_ = fVar194 * local_13d8._0_4_ - fVar177 * fVar142;
                auVar205._4_4_ = fVar198 * local_13d8._4_4_ - fVar178 * fVar139;
                auVar205._8_4_ = fVar202 * local_13d8._8_4_ - fVar179 * fVar140;
                auVar205._12_4_ = fVar206 * local_13d8._12_4_ - fVar188 * fVar160;
                auVar73._4_4_ =
                     -(uint)((float)((uint)(fStack_1304 * fVar198) & uVar152) <
                            (float)((uint)(fVar178 * fVar139) & uVar152));
                auVar73._0_4_ =
                     -(uint)((float)((uint)(local_1308 * fVar194) & uVar28) <
                            (float)((uint)(fVar177 * fVar142) & uVar28));
                auVar73._8_4_ =
                     -(uint)((float)((uint)(fStack_1300 * fVar202) & uVar30) <
                            (float)((uint)(fVar179 * fVar140) & uVar30));
                auVar73._12_4_ =
                     -(uint)((float)((uint)(fStack_12fc * fVar206) & uVar36) <
                            (float)((uint)(fVar188 * fVar160) & uVar36));
                local_1258 = blendvps(auVar205,auVar183,auVar73);
                auVar200._0_4_ = local_1308 * fVar181 - fVar193 * fVar177;
                auVar200._4_4_ = fStack_1304 * fVar168 - fVar195 * fVar178;
                auVar200._8_4_ = fStack_1300 * fVar186 - fVar201 * fVar179;
                auVar200._12_4_ = fStack_12fc * fVar174 - fVar203 * fVar188;
                auVar176._0_4_ = fVar177 * (float)local_1378._0_4_ - fVar181 * local_13d8._0_4_;
                auVar176._4_4_ = fVar178 * (float)local_1378._4_4_ - fVar168 * local_13d8._4_4_;
                auVar176._8_4_ = fVar179 * fStack_1370 - fVar186 * local_13d8._8_4_;
                auVar176._12_4_ = fVar188 * fStack_136c - fVar174 * local_13d8._12_4_;
                auVar74._4_4_ =
                     -(uint)((float)((uint)(fVar195 * fVar178) & uVar152) <
                            (float)((uint)(fVar168 * local_13d8._4_4_) & uVar152));
                auVar74._0_4_ =
                     -(uint)((float)((uint)(fVar193 * fVar177) & uVar28) <
                            (float)((uint)(fVar181 * local_13d8._0_4_) & uVar28));
                auVar74._8_4_ =
                     -(uint)((float)((uint)(fVar201 * fVar179) & uVar30) <
                            (float)((uint)(fVar186 * local_13d8._8_4_) & uVar30));
                auVar74._12_4_ =
                     -(uint)((float)((uint)(fVar203 * fVar188) & uVar36) <
                            (float)((uint)(fVar174 * local_13d8._12_4_) & uVar36));
                local_1248 = blendvps(auVar176,auVar200,auVar74);
                fVar168 = local_1268._4_4_;
                fVar186 = local_1268._8_4_;
                fVar174 = local_1268._12_4_;
                fVar142 = (float)local_1488._0_4_ * local_1268._0_4_ +
                          (float)local_1498 * local_1258._0_4_ + fStack_12ec * local_1248._0_4_;
                fVar151 = (float)local_1488._4_4_ * fVar168 +
                          (float)auStack_1494._0_4_ * local_1258._4_4_ +
                          fStack_12ec * local_1248._4_4_;
                fVar139 = fStack_1480 * fVar186 +
                          (float)auStack_1494._4_4_ * local_1258._8_4_ +
                          fStack_12ec * local_1248._8_4_;
                fVar169 = fStack_147c * fVar174 +
                          fStack_148c * local_1258._12_4_ + fStack_12ec * local_1248._12_4_;
                auVar163._0_4_ = fVar142 + fVar142;
                auVar163._4_4_ = fVar151 + fVar151;
                auVar163._8_4_ = fVar139 + fVar139;
                auVar163._12_4_ = fVar169 + fVar169;
                auVar75._0_4_ = local_13c8 * local_1258._0_4_ + (float)local_1438 * local_1248._0_4_
                ;
                auVar75._4_4_ = fStack_13c4 * local_1258._4_4_ + local_1438._4_4_ * local_1248._4_4_
                ;
                auVar75._8_4_ = fStack_13c0 * local_1258._8_4_ + fStack_1430 * local_1248._8_4_;
                auVar75._12_4_ = fStack_13bc * local_1258._12_4_ + fStack_142c * local_1248._12_4_;
                fVar140 = (float)local_13b8 * local_1268._0_4_ + auVar75._0_4_;
                fVar153 = local_13b8._4_4_ * fVar168 + auVar75._4_4_;
                fVar160 = fStack_13b0 * fVar186 + auVar75._8_4_;
                fVar181 = fStack_13ac * fVar174 + auVar75._12_4_;
                auVar147 = rcpps(auVar75,auVar163);
                fVar142 = auVar147._0_4_;
                fVar151 = auVar147._4_4_;
                fVar139 = auVar147._8_4_;
                fVar169 = auVar147._12_4_;
                auVar114._0_4_ =
                     ((1.0 - auVar163._0_4_ * fVar142) * fVar142 + fVar142) * (fVar140 + fVar140);
                auVar114._4_4_ =
                     ((1.0 - auVar163._4_4_ * fVar151) * fVar151 + fVar151) * (fVar153 + fVar153);
                auVar114._8_4_ =
                     ((1.0 - auVar163._8_4_ * fVar139) * fVar139 + fVar139) * (fVar160 + fVar160);
                auVar114._12_4_ =
                     ((1.0 - auVar163._12_4_ * fVar169) * fVar169 + fVar169) * (fVar181 + fVar181);
                local_1498 = (undefined1  [4])(ray->super_RayK<1>).tfar;
                auStack_1494._0_4_ = (ray->super_RayK<1>).mask;
                auStack_1494._4_4_ = (ray->super_RayK<1>).id;
                fStack_148c = (float)(ray->super_RayK<1>).flags;
                fVar142 = (ray->super_RayK<1>).org.field_0.m128[3];
                auVar164._0_4_ =
                     (int)((uint)(auVar163._0_4_ != 0.0 &&
                                 (auVar114._0_4_ <= (float)local_1498 && fVar142 <= auVar114._0_4_))
                          * -0x80000000) >> 0x1f;
                auVar164._4_4_ =
                     (int)((uint)(auVar163._4_4_ != 0.0 &&
                                 (auVar114._4_4_ <= (float)local_1498 && fVar142 <= auVar114._4_4_))
                          * -0x80000000) >> 0x1f;
                auVar164._8_4_ =
                     (int)((uint)(auVar163._8_4_ != 0.0 &&
                                 (auVar114._8_4_ <= (float)local_1498 && fVar142 <= auVar114._8_4_))
                          * -0x80000000) >> 0x1f;
                auVar164._12_4_ =
                     (int)((uint)(auVar163._12_4_ != 0.0 &&
                                 (auVar114._12_4_ <= (float)local_1498 && fVar142 <= auVar114._12_4_
                                 )) * -0x80000000) >> 0x1f;
                auVar165 = auVar164 & auVar96;
                iVar41 = movmskps(iVar41,auVar165);
                if (iVar41 != 0) {
                  uVar34 = extractps(_local_1498,1);
                  local_12b8 = &local_14a5;
                  local_12a8 = auVar165;
                  local_1278 = auVar114;
                  auVar126._0_4_ = local_12c8._0_4_ - auVar197._0_4_;
                  auVar126._4_4_ = local_12c8._4_4_ - auVar197._4_4_;
                  auVar126._8_4_ = local_12c8._8_4_ - auVar197._8_4_;
                  auVar126._12_4_ = local_12c8._12_4_ - auVar197._12_4_;
                  auVar97._4_12_ = auVar96._4_12_;
                  auVar97._0_4_ = (float)(int)(*(ushort *)(lVar32 + 8 + lVar45) - 1);
                  auVar166._4_4_ = auVar96._4_4_;
                  auVar166._0_4_ = auVar97._0_4_;
                  auVar166._8_4_ = auVar96._8_4_;
                  auVar166._12_4_ = auVar96._12_4_;
                  auVar147 = rcpss(auVar166,auVar97);
                  auVar172._4_12_ = local_1268._4_12_;
                  auVar172._0_4_ = (float)(int)(*(ushort *)(lVar32 + 10 + lVar45) - 1);
                  fStack_12dc = (2.0 - auVar97._0_4_ * auVar147._0_4_) * auVar147._0_4_;
                  auVar167._4_4_ = fVar168;
                  auVar167._0_4_ = auVar172._0_4_;
                  auVar167._8_4_ = fVar186;
                  auVar167._12_4_ = fVar174;
                  auVar147 = rcpss(auVar167,auVar172);
                  fVar142 = (2.0 - auVar172._0_4_ * auVar147._0_4_) * auVar147._0_4_;
                  local_12e8._0_4_ =
                       fStack_12dc *
                       ((float)(int)local_1118._0_4_ * local_12c8._0_4_ +
                       (local_12c8._0_4_ - fVar189));
                  local_12e8._4_4_ =
                       fStack_12dc *
                       ((float)(local_1118._0_4_ + 1) * local_12c8._4_4_ +
                       (local_12c8._4_4_ - fVar190));
                  fStack_12e0 = fStack_12dc *
                                ((float)(local_1118._0_4_ + 1) * local_12c8._8_4_ +
                                (local_12c8._8_4_ - local_13e8._8_4_));
                  fStack_12dc = fStack_12dc *
                                ((float)(int)local_1118._0_4_ * local_12c8._12_4_ +
                                (local_12c8._12_4_ - local_13e8._12_4_));
                  local_12d8._0_4_ =
                       fVar142 * ((float)(int)local_1128._0_4_ * local_12c8._0_4_ + auVar126._0_4_);
                  local_12d8._4_4_ =
                       fVar142 * ((float)(int)local_1128._0_4_ * local_12c8._4_4_ + auVar126._4_4_);
                  fStack_12d0 = fVar142 * ((float)(local_1128._0_4_ + 1) * local_12c8._8_4_ +
                                          auVar126._8_4_);
                  fStack_12cc = fVar142 * ((float)(local_1128._0_4_ + 1) * local_12c8._12_4_ +
                                          auVar126._12_4_);
                  pGVar12 = (context->scene->geometries).items[local_14a4._4_8_].ptr;
                  if ((pGVar12->mask & (uint)uVar34) != 0) {
                    _local_1428 = auVar165;
                    auVar147 = rcpps(auVar126,local_12c8);
                    fVar142 = auVar147._0_4_;
                    fVar151 = auVar147._4_4_;
                    fVar139 = auVar147._8_4_;
                    fVar169 = auVar147._12_4_;
                    local_1328._4_4_ = (undefined4)((ulong)local_1328 >> 0x20);
                    fVar142 = (float)(-(uint)(1e-18 <= (float)local_1328._0_4_) &
                                     (uint)(((float)DAT_01f46a60 - local_12c8._0_4_ * fVar142) *
                                            fVar142 + fVar142));
                    fVar151 = (float)(-(uint)(1e-18 <= (float)local_1328._4_4_) &
                                     (uint)((DAT_01f46a60._4_4_ - local_12c8._4_4_ * fVar151) *
                                            fVar151 + fVar151));
                    fVar139 = (float)(-(uint)(1e-18 <= fStack_1320) &
                                     (uint)((DAT_01f46a60._8_4_ - local_12c8._8_4_ * fVar139) *
                                            fVar139 + fVar139));
                    fVar169 = (float)(-(uint)(1e-18 <= fStack_131c) &
                                     (uint)((DAT_01f46a60._12_4_ - local_12c8._12_4_ * fVar169) *
                                            fVar169 + fVar169));
                    auVar184._0_4_ = (float)local_12e8._0_4_ * fVar142;
                    auVar184._4_4_ = (float)local_12e8._4_4_ * fVar151;
                    auVar184._8_4_ = fStack_12e0 * fVar139;
                    auVar184._12_4_ = fStack_12dc * fVar169;
                    local_1298 = minps(auVar184,_DAT_01f46a60);
                    auVar98._0_4_ = (float)local_12d8._0_4_ * fVar142;
                    auVar98._4_4_ = (float)local_12d8._4_4_ * fVar151;
                    auVar98._8_4_ = fStack_12d0 * fVar139;
                    auVar98._12_4_ = fStack_12cc * fVar169;
                    local_1288 = minps(auVar98,_DAT_01f46a60);
                    auVar147 = blendvps(_DAT_01f45a30,auVar114,auVar165);
                    auVar115._4_4_ = auVar147._0_4_;
                    auVar115._0_4_ = auVar147._4_4_;
                    auVar115._8_4_ = auVar147._12_4_;
                    auVar115._12_4_ = auVar147._8_4_;
                    auVar89 = minps(auVar115,auVar147);
                    auVar127._0_8_ = auVar89._8_8_;
                    auVar127._8_4_ = auVar89._0_4_;
                    auVar127._12_4_ = auVar89._4_4_;
                    auVar89 = minps(auVar127,auVar89);
                    auVar128._0_8_ =
                         CONCAT44(-(uint)(auVar89._4_4_ == auVar147._4_4_) & auVar165._4_4_,
                                  -(uint)(auVar89._0_4_ == auVar147._0_4_) & auVar165._0_4_);
                    auVar128._8_4_ = -(uint)(auVar89._8_4_ == auVar147._8_4_) & auVar165._8_4_;
                    auVar128._12_4_ = -(uint)(auVar89._12_4_ == auVar147._12_4_) & auVar165._12_4_;
                    iVar41 = movmskps((uint)uVar34,auVar128);
                    if (iVar41 != 0) {
                      auVar165._8_4_ = auVar128._8_4_;
                      auVar165._0_8_ = auVar128._0_8_;
                      auVar165._12_4_ = auVar128._12_4_;
                    }
                    uVar29 = movmskps(iVar41,auVar165);
                    uVar44 = CONCAT44((int)((ulong)uVar34 >> 0x20),uVar29);
                    lVar32 = 0;
                    if (uVar44 != 0) {
                      for (; (uVar44 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                      }
                    }
                    pRVar14 = context->args;
                    if (pRVar14->filter == (RTCFilterFunctionN)0x0) {
                      pRVar47 = context->user;
                      if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar142 = *(float *)(local_1298 + lVar32 * 4);
                        fVar151 = *(float *)(local_1288 + lVar32 * 4);
                        fVar139 = *(float *)(local_1268 + lVar32 * 4);
                        fVar169 = *(float *)(local_1258 + lVar32 * 4);
                        fVar140 = *(float *)(local_1248 + lVar32 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1278 + lVar32 * 4);
                        (ray->Ng).field_0.field_0.x = fVar139;
                        (ray->Ng).field_0.field_0.y = fVar169;
                        (ray->Ng).field_0.field_0.z = fVar140;
                        ray->u = fVar142;
                        ray->v = fVar151;
                        ray->primID = (uint)local_1460;
                        ray->geomID = (uint)local_14a4._4_8_;
                        ray->instID[0] = pRVar47->instID[0];
                        ray->instPrimID[0] = pRVar47->instPrimID[0];
                        context = local_1368;
                        goto LAB_006b86a1;
                      }
                    }
                    else {
                      pRVar47 = context->user;
                    }
                    _local_1488 = auVar114;
                    _local_1328 = auVar182;
                    local_12f8 = fStack_12ec;
                    fStack_12f4 = fStack_12ec;
                    fStack_12f0 = fStack_12ec;
                    while( true ) {
                      local_139c = *(undefined4 *)(local_1298 + lVar32 * 4);
                      local_1398 = *(undefined4 *)(local_1288 + lVar32 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1278 + lVar32 * 4);
                      local_13a8 = *(float *)(local_1268 + lVar32 * 4);
                      local_13a4 = (float)*(undefined4 *)(local_1258 + lVar32 * 4);
                      local_13a0 = *(undefined4 *)(local_1248 + lVar32 * 4);
                      local_1394 = (int)local_1460;
                      local_1390 = (int)local_14a4._4_8_;
                      local_138c = pRVar47->instID[0];
                      local_1388 = pRVar47->instPrimID[0];
                      local_14a4._0_4_ = -NAN;
                      local_1418.valid = (int *)local_14a4;
                      local_1418.geometryUserPtr = pGVar12->userPtr;
                      local_1418.context = pRVar47;
                      local_1418.ray = (RTCRayN *)ray;
                      local_1418.hit = (RTCHitN *)&local_13a8;
                      local_1418.N = 1;
                      if (((pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                          ((*pGVar12->intersectionFilterN)(&local_1418), auVar114 = _local_1488,
                          (((RayK<1> *)local_1418.valid)->org).field_0.m128[0] != 0.0)) &&
                         (((pRVar14->filter == (RTCFilterFunctionN)0x0 ||
                           (((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                             RTC_RAY_QUERY_FLAG_INCOHERENT &&
                            (((pGVar12->field_8).field_0x2 & 0x40) == 0)))) ||
                          ((*pRVar14->filter)(&local_1418), auVar114 = _local_1488,
                          (((RayK<1> *)local_1418.valid)->org).field_0.m128[0] != 0.0)))) {
                        (((Vec3f *)((long)local_1418.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_1418.hit;
                        (((Vec3f *)((long)local_1418.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_1418.hit + 4);
                        (((Vec3f *)((long)local_1418.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_1418.hit + 8);
                        *(float *)((long)local_1418.ray + 0x3c) = *(float *)(local_1418.hit + 0xc);
                        *(float *)((long)local_1418.ray + 0x40) = *(float *)(local_1418.hit + 0x10);
                        *(float *)((long)local_1418.ray + 0x44) = *(float *)(local_1418.hit + 0x14);
                        *(float *)((long)local_1418.ray + 0x48) = *(float *)(local_1418.hit + 0x18);
                        *(float *)((long)local_1418.ray + 0x4c) = *(float *)(local_1418.hit + 0x1c);
                        *(float *)((long)local_1418.ray + 0x50) = *(float *)(local_1418.hit + 0x20);
                        pRVar35 = (RayHit *)local_1418.ray;
                      }
                      else {
                        (ray->super_RayK<1>).tfar = (float)local_1498;
                        pRVar35 = (RayHit *)local_1418.valid;
                        auVar114 = _local_1488;
                      }
                      *(undefined4 *)(local_1428 + lVar32 * 4) = 0;
                      local_1498 = (undefined1  [4])(ray->super_RayK<1>).tfar;
                      auStack_1494._0_4_ = (ray->super_RayK<1>).mask;
                      auStack_1494._4_4_ = (ray->super_RayK<1>).id;
                      fStack_148c = (float)(ray->super_RayK<1>).flags;
                      auVar77._0_4_ =
                           -(uint)(auVar114._0_4_ <= (float)local_1498) & local_1428._0_4_;
                      auVar77._4_4_ =
                           -(uint)(auVar114._4_4_ <= (float)local_1498) & local_1428._4_4_;
                      auVar77._8_4_ = -(uint)(auVar114._8_4_ <= (float)local_1498) & uStack_1420;
                      auVar77._12_4_ = -(uint)(auVar114._12_4_ <= (float)local_1498) & uStack_141c;
                      _local_1428 = auVar77;
                      iVar41 = movmskps((int)pRVar35,auVar77);
                      context = local_1368;
                      uVar37 = local_11d8;
                      pauVar42 = local_11c8;
                      uVar43 = local_11d0;
                      auVar175 = local_1048;
                      fVar180 = local_1228;
                      fVar204 = fStack_1224;
                      fVar159 = fStack_1220;
                      fVar173 = fStack_121c;
                      fVar185 = local_1238;
                      fVar116 = fStack_1234;
                      fVar131 = fStack_1230;
                      fVar132 = fStack_122c;
                      fVar187 = local_10a8;
                      fVar133 = fStack_10a4;
                      fVar134 = fStack_10a0;
                      fVar141 = fStack_109c;
                      if (iVar41 == 0) break;
                      auVar147 = blendvps(_DAT_01f45a30,auVar114,auVar77);
                      auVar130._4_4_ = auVar147._0_4_;
                      auVar130._0_4_ = auVar147._4_4_;
                      auVar130._8_4_ = auVar147._12_4_;
                      auVar130._12_4_ = auVar147._8_4_;
                      auVar182 = minps(auVar130,auVar147);
                      auVar101._0_8_ = auVar182._8_8_;
                      auVar101._8_4_ = auVar182._0_4_;
                      auVar101._12_4_ = auVar182._4_4_;
                      auVar182 = minps(auVar101,auVar182);
                      auVar102._0_8_ =
                           CONCAT44(-(uint)(auVar182._4_4_ == auVar147._4_4_) & auVar77._4_4_,
                                    -(uint)(auVar182._0_4_ == auVar147._0_4_) & auVar77._0_4_);
                      auVar102._8_4_ = -(uint)(auVar182._8_4_ == auVar147._8_4_) & auVar77._8_4_;
                      auVar102._12_4_ = -(uint)(auVar182._12_4_ == auVar147._12_4_) & auVar77._12_4_
                      ;
                      iVar41 = movmskps(iVar41,auVar102);
                      if (iVar41 != 0) {
                        auVar77._8_4_ = auVar102._8_4_;
                        auVar77._0_8_ = auVar102._0_8_;
                        auVar77._12_4_ = auVar102._12_4_;
                      }
                      uVar29 = movmskps(iVar41,auVar77);
                      uVar37 = CONCAT44((int)((ulong)pRVar35 >> 0x20),uVar29);
                      lVar32 = 0;
                      if (uVar37 != 0) {
                        for (; (uVar37 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_006b86a1;
          }
          auVar182 = local_10e8;
          auVar147 = local_10b8;
          auVar89 = local_1108;
          auVar87 = local_1198;
          auVar170 = local_10c8;
          auVar191 = local_10d8;
          fVar169 = local_10f8;
          fVar142 = fStack_10f4;
          fVar151 = fStack_10f0;
          fVar139 = fStack_10ec;
        }
        fVar140 = (ray->super_RayK<1>).tfar;
        auVar175._4_4_ = fVar140;
        auVar175._0_4_ = fVar140;
        auVar175._8_4_ = fVar140;
        auVar175._12_4_ = fVar140;
      }
      goto LAB_006b81f2;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }